

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conelinei_intersector.h
# Opt level: O3

void embree::avx2::ConeCurveMiIntersectorK<8,_8,_true>::intersect
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *line)

{
  undefined4 uVar1;
  ushort uVar2;
  ushort uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  Geometry *pGVar10;
  long lVar11;
  RTCFilterFunctionN p_Var12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  float fVar36;
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  uint uVar70;
  uint uVar71;
  int iVar72;
  Scene *pSVar73;
  ulong uVar74;
  float fVar75;
  undefined4 uVar76;
  float fVar84;
  float fVar85;
  float fVar86;
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  float fVar94;
  float fVar95;
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  float fVar109;
  undefined1 auVar110 [16];
  float fVar119;
  float fVar120;
  undefined1 auVar111 [32];
  float fVar121;
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [64];
  undefined1 auVar125 [32];
  undefined1 auVar126 [64];
  float fVar127;
  float fVar135;
  float fVar136;
  float fVar137;
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [64];
  float fVar138;
  float fVar147;
  float fVar148;
  float fVar149;
  float fVar150;
  float fVar151;
  float fVar152;
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [64];
  float fVar160;
  float fVar161;
  float fVar162;
  float fVar163;
  float fVar164;
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [64];
  undefined1 auVar165 [32];
  undefined1 auVar166 [64];
  float fVar167;
  float fVar170;
  float fVar171;
  float fVar172;
  undefined1 auVar168 [32];
  undefined1 auVar169 [64];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar176 [28];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [64];
  undefined1 auVar180 [28];
  undefined1 auVar181 [32];
  undefined1 auVar182 [64];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [64];
  float fVar186;
  float fVar187;
  float fVar190;
  float fVar191;
  float fVar192;
  float fVar193;
  float fVar194;
  float fVar195;
  float fVar196;
  float fVar197;
  float fVar198;
  float fVar199;
  undefined1 auVar188 [32];
  undefined1 auVar189 [64];
  Scene *scene;
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  RoundLineIntersectorHitM<8> hit;
  RTCFilterFunctionNArguments local_710;
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_650 [16];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [8];
  float fStack_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  float fStack_5e8;
  undefined4 uStack_5e4;
  undefined1 local_5e0 [8];
  float fStack_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float fStack_5c8;
  undefined1 local_5c0 [16];
  undefined1 auStack_5b0 [16];
  undefined1 local_5a0 [16];
  undefined1 auStack_590 [16];
  undefined1 local_580 [32];
  undefined1 local_560 [8];
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  float fStack_544;
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  float local_3a0;
  float fStack_39c;
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  float fStack_384;
  undefined1 local_380 [32];
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  undefined1 local_340 [32];
  float local_320;
  float fStack_31c;
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  undefined4 uStack_304;
  undefined1 local_2f0 [16];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined4 local_280;
  undefined4 uStack_27c;
  undefined4 uStack_278;
  undefined4 uStack_274;
  undefined4 uStack_270;
  undefined4 uStack_26c;
  undefined4 uStack_268;
  undefined4 uStack_264;
  undefined4 local_260;
  undefined4 uStack_25c;
  undefined4 uStack_258;
  undefined4 uStack_254;
  undefined4 uStack_250;
  undefined4 uStack_24c;
  undefined4 uStack_248;
  undefined4 uStack_244;
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  uint local_200;
  uint uStack_1fc;
  uint uStack_1f8;
  uint uStack_1f4;
  uint uStack_1f0;
  uint uStack_1ec;
  uint uStack_1e8;
  uint uStack_1e4;
  uint local_1e0;
  uint uStack_1dc;
  uint uStack_1d8;
  uint uStack_1d4;
  uint uStack_1d0;
  uint uStack_1cc;
  uint uStack_1c8;
  uint uStack_1c4;
  undefined1 local_1c0 [8];
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  undefined4 uStack_1a4;
  uint local_1a0 [4];
  uint uStack_190;
  uint uStack_18c;
  uint uStack_188;
  uint uStack_184;
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  undefined1 local_100 [32];
  float local_e0;
  float fStack_dc;
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  float fStack_c4;
  float local_c0;
  float fStack_bc;
  float fStack_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float fStack_a8;
  float fStack_a4;
  float local_a0;
  float fStack_9c;
  float fStack_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  undefined4 uStack_84;
  undefined1 local_80 [32];
  undefined1 auVar118 [32];
  undefined1 auVar175 [64];
  
  local_650._8_8_ = local_650._0_8_;
  local_650._0_8_ = context;
  pSVar73 = context->scene;
  local_1a0[0] = line->sharedGeomID;
  uVar71 = (line->v0).field_0.i[0];
  pGVar10 = (pSVar73->geometries).items[local_1a0[0]].ptr;
  lVar11 = *(long *)&pGVar10[1].time_range.upper;
  p_Var12 = pGVar10[1].intersectionFilterN;
  uVar70 = (line->v0).field_0.i[1];
  uVar4 = (line->v0).field_0.i[2];
  uVar5 = (line->v0).field_0.i[4];
  auVar77._16_16_ = *(undefined1 (*) [16])(lVar11 + (ulong)uVar5 * (long)p_Var12);
  auVar77._0_16_ = *(undefined1 (*) [16])(lVar11 + (ulong)uVar71 * (long)p_Var12);
  uVar6 = (line->v0).field_0.i[3];
  uVar7 = (line->v0).field_0.i[5];
  auVar87._16_16_ = *(undefined1 (*) [16])(lVar11 + (ulong)uVar7 * (long)p_Var12);
  auVar87._0_16_ = *(undefined1 (*) [16])(lVar11 + (ulong)uVar70 * (long)p_Var12);
  uVar8 = (line->v0).field_0.i[6];
  auVar92._16_16_ = *(undefined1 (*) [16])(lVar11 + (ulong)uVar8 * (long)p_Var12);
  auVar92._0_16_ = *(undefined1 (*) [16])(lVar11 + (ulong)uVar4 * (long)p_Var12);
  uVar9 = (line->v0).field_0.i[7];
  auVar111._16_16_ = *(undefined1 (*) [16])(lVar11 + (ulong)uVar9 * (long)p_Var12);
  auVar111._0_16_ = *(undefined1 (*) [16])(lVar11 + (ulong)uVar6 * (long)p_Var12);
  auVar110 = *(undefined1 (*) [16])(lVar11 + (ulong)(uVar5 + 1) * (long)p_Var12);
  auVar153._0_16_ =
       ZEXT116(0) * auVar110 +
       ZEXT116(1) * *(undefined1 (*) [16])(lVar11 + (ulong)(uVar71 + 1) * (long)p_Var12);
  auVar153._16_16_ = ZEXT116(1) * auVar110;
  auVar110 = *(undefined1 (*) [16])(lVar11 + (ulong)(uVar7 + 1) * (long)p_Var12);
  auVar125._0_16_ =
       ZEXT116(0) * auVar110 +
       ZEXT116(1) * *(undefined1 (*) [16])(lVar11 + (ulong)(uVar70 + 1) * (long)p_Var12);
  auVar125._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar110;
  auVar110 = *(undefined1 (*) [16])(lVar11 + (ulong)(uVar8 + 1) * (long)p_Var12);
  auVar128._0_16_ =
       ZEXT116(0) * auVar110 +
       ZEXT116(1) * *(undefined1 (*) [16])(lVar11 + (ulong)(uVar4 + 1) * (long)p_Var12);
  auVar128._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar110;
  auVar110 = *(undefined1 (*) [16])(lVar11 + (ulong)(uVar9 + 1) * (long)p_Var12);
  auVar139._0_16_ =
       ZEXT116(0) * auVar110 +
       ZEXT116(1) * *(undefined1 (*) [16])(lVar11 + (ulong)(uVar6 + 1) * (long)p_Var12);
  auVar139._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar110;
  auVar132 = vunpcklps_avx(auVar77,auVar92);
  auVar90 = vunpckhps_avx(auVar77,auVar92);
  auVar144 = vunpcklps_avx(auVar87,auVar111);
  auVar115 = vunpckhps_avx(auVar87,auVar111);
  auVar96 = vunpcklps_avx(auVar132,auVar144);
  auVar132 = vunpckhps_avx(auVar132,auVar144);
  auVar122 = vunpcklps_avx(auVar90,auVar115);
  auVar144 = vunpckhps_avx(auVar90,auVar115);
  auVar92 = vpunpckldq_avx2(auVar153,auVar128);
  auVar115 = vpunpckhdq_avx2(auVar153,auVar128);
  auVar111 = vpunpckldq_avx2(auVar125,auVar139);
  auVar87 = vpunpckhdq_avx2(auVar125,auVar139);
  auVar125 = vpunpckldq_avx2(auVar92,auVar111);
  uVar2 = line->leftExists;
  uVar3 = line->rightExists;
  auVar90 = vpcmpeqd_avx2(auVar153,auVar153);
  auVar77 = vpcmpeqd_avx2(auVar90,(undefined1  [32])(line->primIDs).field_0);
  local_1a0[1] = local_1a0[0];
  local_1a0[2] = local_1a0[0];
  local_1a0[3] = local_1a0[0];
  uStack_190 = local_1a0[0];
  uStack_18c = local_1a0[0];
  uStack_188 = local_1a0[0];
  uStack_184 = local_1a0[0];
  fVar187 = *(float *)(ray + k * 4 + 0x80);
  local_520._4_4_ = fVar187;
  local_520._0_4_ = fVar187;
  local_520._8_4_ = fVar187;
  local_520._12_4_ = fVar187;
  local_520._16_4_ = fVar187;
  local_520._20_4_ = fVar187;
  local_520._24_4_ = fVar187;
  local_520._28_4_ = fVar187;
  fVar191 = *(float *)(ray + k * 4 + 0xa0);
  local_380._4_4_ = fVar191;
  local_380._0_4_ = fVar191;
  local_380._8_4_ = fVar191;
  local_380._12_4_ = fVar191;
  local_380._16_4_ = fVar191;
  local_380._20_4_ = fVar191;
  local_380._24_4_ = fVar191;
  local_380._28_4_ = fVar191;
  local_3a0 = *(float *)(ray + k * 4 + 0xc0);
  auVar92 = vpunpckhdq_avx2(auVar92,auVar111);
  auVar110 = vfmadd231ps_fma(ZEXT432((uint)(local_3a0 * local_3a0)),local_380,local_380);
  auVar110 = vfmadd231ps_fma(ZEXT1632(auVar110),local_520,local_520);
  auVar129._0_4_ = auVar110._0_4_;
  auVar129._4_4_ = auVar129._0_4_;
  auVar129._8_4_ = auVar129._0_4_;
  auVar129._12_4_ = auVar129._0_4_;
  auVar129._16_4_ = auVar129._0_4_;
  auVar129._20_4_ = auVar129._0_4_;
  auVar129._24_4_ = auVar129._0_4_;
  auVar129._28_4_ = auVar129._0_4_;
  auVar90 = vrcpps_avx(auVar129);
  auVar111 = vpunpckldq_avx2(auVar115,auVar87);
  auVar87 = vpunpckhdq_avx2(auVar115,auVar87);
  auVar78._8_4_ = 0x3f800000;
  auVar78._0_8_ = 0x3f8000003f800000;
  auVar78._12_4_ = 0x3f800000;
  auVar78._16_4_ = 0x3f800000;
  auVar78._20_4_ = 0x3f800000;
  auVar78._24_4_ = 0x3f800000;
  auVar78._28_4_ = 0x3f800000;
  auVar110 = vfnmadd213ps_fma(auVar129,auVar90,auVar78);
  auVar110 = vfmadd132ps_fma(ZEXT1632(auVar110),auVar90,auVar90);
  auVar34._4_4_ = (auVar125._4_4_ + auVar96._4_4_) * 0.5;
  auVar34._0_4_ = (auVar125._0_4_ + auVar96._0_4_) * 0.5;
  auVar34._8_4_ = (auVar125._8_4_ + auVar96._8_4_) * 0.5;
  auVar34._12_4_ = (auVar125._12_4_ + auVar96._12_4_) * 0.5;
  auVar34._16_4_ = (auVar125._16_4_ + auVar96._16_4_) * 0.5;
  auVar34._20_4_ = (auVar125._20_4_ + auVar96._20_4_) * 0.5;
  auVar34._24_4_ = (auVar125._24_4_ + auVar96._24_4_) * 0.5;
  auVar34._28_4_ = auVar125._28_4_ + auVar96._28_4_;
  auVar90._4_4_ = (auVar92._4_4_ + auVar132._4_4_) * 0.5;
  auVar90._0_4_ = (auVar92._0_4_ + auVar132._0_4_) * 0.5;
  auVar90._8_4_ = (auVar92._8_4_ + auVar132._8_4_) * 0.5;
  auVar90._12_4_ = (auVar92._12_4_ + auVar132._12_4_) * 0.5;
  auVar90._16_4_ = (auVar92._16_4_ + auVar132._16_4_) * 0.5;
  auVar90._20_4_ = (auVar92._20_4_ + auVar132._20_4_) * 0.5;
  auVar90._24_4_ = (auVar92._24_4_ + auVar132._24_4_) * 0.5;
  auVar90._28_4_ = auVar92._28_4_ + auVar132._28_4_;
  auVar115._4_4_ = (auVar122._4_4_ + auVar111._4_4_) * 0.5;
  auVar115._0_4_ = (auVar122._0_4_ + auVar111._0_4_) * 0.5;
  auVar115._8_4_ = (auVar122._8_4_ + auVar111._8_4_) * 0.5;
  auVar115._12_4_ = (auVar122._12_4_ + auVar111._12_4_) * 0.5;
  auVar115._16_4_ = (auVar122._16_4_ + auVar111._16_4_) * 0.5;
  auVar115._20_4_ = (auVar122._20_4_ + auVar111._20_4_) * 0.5;
  auVar115._24_4_ = (auVar122._24_4_ + auVar111._24_4_) * 0.5;
  auVar115._28_4_ = 0x3f000000;
  fVar193 = *(float *)(ray + k * 4 + 0x20);
  auVar154._4_4_ = fVar193;
  auVar154._0_4_ = fVar193;
  auVar154._8_4_ = fVar193;
  auVar154._12_4_ = fVar193;
  auVar154._16_4_ = fVar193;
  auVar154._20_4_ = fVar193;
  auVar154._24_4_ = fVar193;
  auVar154._28_4_ = fVar193;
  auVar90 = vsubps_avx(auVar90,auVar154);
  fVar160 = *(float *)(ray + k * 4 + 0x40);
  auVar165._4_4_ = fVar160;
  auVar165._0_4_ = fVar160;
  auVar165._8_4_ = fVar160;
  auVar165._12_4_ = fVar160;
  auVar165._16_4_ = fVar160;
  auVar165._20_4_ = fVar160;
  auVar165._24_4_ = fVar160;
  auVar165._28_4_ = fVar160;
  auVar115 = vsubps_avx(auVar115,auVar165);
  auVar35._4_4_ = local_3a0 * auVar115._4_4_;
  auVar35._0_4_ = local_3a0 * auVar115._0_4_;
  auVar35._8_4_ = local_3a0 * auVar115._8_4_;
  auVar35._12_4_ = local_3a0 * auVar115._12_4_;
  auVar35._16_4_ = local_3a0 * auVar115._16_4_;
  auVar35._20_4_ = local_3a0 * auVar115._20_4_;
  auVar35._24_4_ = local_3a0 * auVar115._24_4_;
  auVar35._28_4_ = auVar115._28_4_;
  auVar31 = vfmadd231ps_fma(auVar35,local_380,auVar90);
  fVar196 = *(float *)(ray + k * 4);
  auVar140._4_4_ = fVar196;
  auVar140._0_4_ = fVar196;
  auVar140._8_4_ = fVar196;
  auVar140._12_4_ = fVar196;
  auVar140._16_4_ = fVar196;
  auVar140._20_4_ = fVar196;
  auVar140._24_4_ = fVar196;
  auVar140._28_4_ = fVar196;
  auVar90 = vsubps_avx(auVar34,auVar140);
  auVar31 = vfmadd231ps_fma(ZEXT1632(auVar31),local_520,auVar90);
  fVar127 = auVar31._0_4_ * auVar110._0_4_;
  fVar135 = auVar31._4_4_ * auVar110._4_4_;
  fVar136 = auVar31._8_4_ * auVar110._8_4_;
  fVar137 = auVar31._12_4_ * auVar110._12_4_;
  auVar79._0_4_ = fVar196 + fVar187 * fVar127;
  auVar79._4_4_ = fVar196 + fVar187 * fVar135;
  auVar79._8_4_ = fVar196 + fVar187 * fVar136;
  auVar79._12_4_ = fVar196 + fVar187 * fVar137;
  auVar79._16_4_ = fVar196 + fVar187 * 0.0;
  auVar79._20_4_ = fVar196 + fVar187 * 0.0;
  auVar79._24_4_ = fVar196 + fVar187 * 0.0;
  auVar79._28_4_ = fVar196 + 0.0;
  auVar141._0_4_ = fVar193 + fVar191 * fVar127;
  auVar141._4_4_ = fVar193 + fVar191 * fVar135;
  auVar141._8_4_ = fVar193 + fVar191 * fVar136;
  auVar141._12_4_ = fVar193 + fVar191 * fVar137;
  auVar141._16_4_ = fVar193 + fVar191 * 0.0;
  auVar141._20_4_ = fVar193 + fVar191 * 0.0;
  auVar141._24_4_ = fVar193 + fVar191 * 0.0;
  auVar141._28_4_ = fVar193 + auVar90._28_4_;
  auVar130._0_4_ = fVar160 + local_3a0 * fVar127;
  auVar130._4_4_ = fVar160 + local_3a0 * fVar135;
  auVar130._8_4_ = fVar160 + local_3a0 * fVar136;
  auVar130._12_4_ = fVar160 + local_3a0 * fVar137;
  auVar130._16_4_ = fVar160 + local_3a0 * 0.0;
  auVar130._20_4_ = fVar160 + local_3a0 * 0.0;
  auVar130._24_4_ = fVar160 + local_3a0 * 0.0;
  auVar130._28_4_ = fVar160 + auVar90._28_4_;
  local_3e0 = vsubps_avx(auVar125,auVar96);
  _local_540 = vsubps_avx(auVar79,auVar96);
  local_6e0 = vsubps_avx(auVar92,auVar132);
  _local_560 = vsubps_avx(auVar141,auVar132);
  local_6a0 = vsubps_avx(auVar111,auVar122);
  local_3c0 = vsubps_avx(auVar130,auVar122);
  fVar199 = local_6a0._0_4_;
  fVar15 = local_6a0._4_4_;
  auVar132._4_4_ = fVar15 * fVar15;
  auVar132._0_4_ = fVar199 * fVar199;
  fVar18 = local_6a0._8_4_;
  auVar132._8_4_ = fVar18 * fVar18;
  fVar21 = local_6a0._12_4_;
  auVar132._12_4_ = fVar21 * fVar21;
  fVar24 = local_6a0._16_4_;
  auVar132._16_4_ = fVar24 * fVar24;
  fVar26 = local_6a0._20_4_;
  auVar132._20_4_ = fVar26 * fVar26;
  fVar28 = local_6a0._24_4_;
  auVar132._24_4_ = fVar28 * fVar28;
  auVar132._28_4_ = auVar96._28_4_;
  auVar110 = vfmadd231ps_fma(auVar132,local_6e0,local_6e0);
  auVar110 = vfmadd231ps_fma(ZEXT1632(auVar110),local_3e0,local_3e0);
  fVar13 = local_3c0._0_4_;
  fVar16 = local_3c0._4_4_;
  auVar96._4_4_ = fVar15 * fVar16;
  auVar96._0_4_ = fVar199 * fVar13;
  fVar19 = local_3c0._8_4_;
  auVar96._8_4_ = fVar18 * fVar19;
  fVar22 = local_3c0._12_4_;
  auVar96._12_4_ = fVar21 * fVar22;
  fVar25 = local_3c0._16_4_;
  auVar96._16_4_ = fVar24 * fVar25;
  fVar27 = local_3c0._20_4_;
  auVar96._20_4_ = fVar26 * fVar27;
  fVar29 = local_3c0._24_4_;
  auVar96._24_4_ = fVar28 * fVar29;
  auVar96._28_4_ = auVar92._28_4_;
  auVar31 = vfmadd231ps_fma(auVar96,_local_560,local_6e0);
  auVar31 = vfmadd231ps_fma(ZEXT1632(auVar31),_local_540,local_3e0);
  auVar122._4_4_ = local_3a0 * fVar15;
  auVar122._0_4_ = local_3a0 * fVar199;
  auVar122._8_4_ = local_3a0 * fVar18;
  auVar122._12_4_ = local_3a0 * fVar21;
  auVar122._16_4_ = local_3a0 * fVar24;
  auVar122._20_4_ = local_3a0 * fVar26;
  auVar122._24_4_ = local_3a0 * fVar28;
  auVar122._28_4_ = auVar125._28_4_;
  auVar32 = vfmadd231ps_fma(auVar122,local_380,local_6e0);
  auVar32 = vfmadd231ps_fma(ZEXT1632(auVar32),local_520,local_3e0);
  auVar90 = vsubps_avx(auVar144,auVar87);
  fVar14 = auVar90._0_4_;
  fVar17 = auVar90._4_4_;
  fVar20 = auVar90._8_4_;
  fVar23 = auVar90._12_4_;
  fVar99 = auVar90._16_4_;
  fVar101 = auVar90._20_4_;
  fVar103 = auVar90._24_4_;
  fVar36 = local_3e0._28_4_;
  fVar193 = auVar110._0_4_;
  fVar138 = fVar14 * fVar14 + fVar193;
  fVar160 = auVar110._4_4_;
  fVar147 = fVar17 * fVar17 + fVar160;
  fVar196 = auVar110._8_4_;
  fVar148 = fVar20 * fVar20 + fVar196;
  fVar161 = auVar110._12_4_;
  fVar149 = fVar23 * fVar23 + fVar161;
  fVar150 = fVar99 * fVar99 + 0.0;
  fVar151 = fVar101 * fVar101 + 0.0;
  fVar152 = fVar103 * fVar103 + 0.0;
  fStack_39c = local_3a0;
  fStack_398 = local_3a0;
  fStack_394 = local_3a0;
  fStack_390 = local_3a0;
  fStack_38c = local_3a0;
  fStack_388 = local_3a0;
  fStack_384 = local_3a0;
  auVar37._4_4_ = local_3a0 * fVar16;
  auVar37._0_4_ = local_3a0 * fVar13;
  auVar37._8_4_ = local_3a0 * fVar19;
  auVar37._12_4_ = local_3a0 * fVar22;
  auVar37._16_4_ = local_3a0 * fVar25;
  auVar37._20_4_ = local_3a0 * fVar27;
  auVar37._24_4_ = local_3a0 * fVar29;
  auVar37._28_4_ = fVar36;
  auVar33 = vfmadd231ps_fma(auVar37,local_380,_local_560);
  auVar33 = vfmadd231ps_fma(ZEXT1632(auVar33),local_520,_local_540);
  fVar109 = fVar193 * fVar193;
  fVar119 = fVar160 * fVar160;
  fVar120 = fVar196 * fVar196;
  fVar121 = fVar161 * fVar161;
  uStack_1a4 = local_6a0._28_4_;
  _local_1c0 = ZEXT1628(CONCAT412(fVar121,CONCAT48(fVar120,CONCAT44(fVar119,fVar109))));
  fVar162 = auVar31._0_4_;
  fVar167 = auVar32._0_4_;
  fVar163 = auVar31._4_4_;
  fVar170 = auVar32._4_4_;
  fVar164 = auVar31._8_4_;
  fVar171 = auVar32._8_4_;
  fVar95 = auVar31._12_4_;
  fVar172 = auVar32._12_4_;
  fVar105 = auVar111._28_4_;
  auVar38._4_4_ = fVar147 * fVar170 * fVar163;
  auVar38._0_4_ = fVar138 * fVar167 * fVar162;
  auVar38._8_4_ = fVar148 * fVar171 * fVar164;
  auVar38._12_4_ = fVar149 * fVar172 * fVar95;
  auVar38._16_4_ = fVar150 * 0.0;
  auVar38._20_4_ = fVar151 * 0.0;
  auVar38._24_4_ = fVar152 * 0.0;
  auVar38._28_4_ = fVar105;
  auVar115 = vsubps_avx(ZEXT1632(CONCAT412(fVar121 * auVar33._12_4_,
                                           CONCAT48(fVar120 * auVar33._8_4_,
                                                    CONCAT44(fVar119 * auVar33._4_4_,
                                                             fVar109 * auVar33._0_4_)))),auVar38);
  auVar122 = ZEXT1632(auVar110);
  fVar186 = auVar144._0_4_;
  fVar94 = fVar186 * fVar193;
  fVar190 = auVar144._4_4_;
  fVar98 = fVar190 * fVar160;
  auVar39._4_4_ = fVar98;
  auVar39._0_4_ = fVar94;
  fVar192 = auVar144._8_4_;
  fVar100 = fVar192 * fVar196;
  auVar39._8_4_ = fVar100;
  fVar194 = auVar144._12_4_;
  fVar102 = fVar194 * fVar161;
  auVar39._12_4_ = fVar102;
  fVar195 = auVar144._16_4_;
  fVar104 = fVar195 * 0.0;
  auVar39._16_4_ = fVar104;
  fVar197 = auVar144._20_4_;
  fVar106 = fVar197 * 0.0;
  auVar39._20_4_ = fVar106;
  fVar198 = auVar144._24_4_;
  fVar108 = fVar198 * 0.0;
  auVar39._24_4_ = fVar108;
  auVar39._28_4_ = fVar105;
  fVar107 = auVar144._28_4_;
  auVar88._0_4_ = fVar167 * fVar14 * fVar94 + auVar115._0_4_;
  auVar88._4_4_ = fVar170 * fVar17 * fVar98 + auVar115._4_4_;
  auVar88._8_4_ = fVar171 * fVar20 * fVar100 + auVar115._8_4_;
  auVar88._12_4_ = fVar172 * fVar23 * fVar102 + auVar115._12_4_;
  auVar88._16_4_ = fVar99 * 0.0 * fVar104 + auVar115._16_4_;
  auVar88._20_4_ = fVar101 * 0.0 * fVar106 + auVar115._20_4_;
  auVar88._24_4_ = fVar103 * 0.0 * fVar108 + auVar115._24_4_;
  auVar88._28_4_ = fVar107 + auVar115._28_4_;
  auVar144._4_4_ = fVar16 * fVar16;
  auVar144._0_4_ = fVar13 * fVar13;
  auVar144._8_4_ = fVar19 * fVar19;
  auVar144._12_4_ = fVar22 * fVar22;
  auVar144._16_4_ = fVar25 * fVar25;
  auVar144._20_4_ = fVar27 * fVar27;
  auVar144._24_4_ = fVar29 * fVar29;
  auVar144._28_4_ = fVar107;
  auVar110 = vfmadd231ps_fma(auVar144,_local_560,_local_560);
  auVar110 = vfmadd231ps_fma(ZEXT1632(auVar110),_local_540,_local_540);
  auVar40._4_4_ = fVar163 * fVar163 * fVar147;
  auVar40._0_4_ = fVar162 * fVar162 * fVar138;
  auVar40._8_4_ = fVar164 * fVar164 * fVar148;
  auVar40._12_4_ = fVar95 * fVar95 * fVar149;
  auVar40._16_4_ = fVar150 * 0.0;
  auVar40._20_4_ = fVar151 * 0.0;
  auVar40._24_4_ = fVar152 * 0.0;
  auVar40._28_4_ = local_540._28_4_;
  auVar115 = vsubps_avx(ZEXT1632(CONCAT412(auVar110._12_4_ * fVar121,
                                           CONCAT48(auVar110._8_4_ * fVar120,
                                                    CONCAT44(auVar110._4_4_ * fVar119,
                                                             auVar110._0_4_ * fVar109)))),auVar40);
  auVar41._4_4_ = (fVar17 + fVar17) * fVar163;
  auVar41._0_4_ = (fVar14 + fVar14) * fVar162;
  auVar41._8_4_ = (fVar20 + fVar20) * fVar164;
  auVar41._12_4_ = (fVar23 + fVar23) * fVar95;
  auVar41._16_4_ = (fVar99 + fVar99) * 0.0;
  auVar41._20_4_ = (fVar101 + fVar101) * 0.0;
  auVar41._24_4_ = (fVar103 + fVar103) * 0.0;
  auVar41._28_4_ = auVar90._28_4_ + auVar90._28_4_;
  auVar90 = vsubps_avx(auVar41,auVar39);
  fVar75 = fVar167 * fVar167;
  fVar84 = fVar170 * fVar170;
  fVar85 = fVar171 * fVar171;
  fVar86 = fVar172 * fVar172;
  auVar42._4_4_ = fVar147 * fVar84;
  auVar42._0_4_ = fVar138 * fVar75;
  auVar42._8_4_ = fVar148 * fVar85;
  auVar42._12_4_ = fVar149 * fVar86;
  auVar42._16_4_ = fVar150 * 0.0;
  auVar42._20_4_ = fVar151 * 0.0;
  auVar42._24_4_ = fVar152 * 0.0;
  auVar42._28_4_ = auVar115._28_4_;
  auVar132 = vsubps_avx(_local_1c0,auVar42);
  auVar43._4_4_ = auVar132._4_4_ * (auVar115._4_4_ + auVar90._4_4_ * fVar98);
  auVar43._0_4_ = auVar132._0_4_ * (auVar115._0_4_ + auVar90._0_4_ * fVar94);
  auVar43._8_4_ = auVar132._8_4_ * (auVar115._8_4_ + auVar90._8_4_ * fVar100);
  auVar43._12_4_ = auVar132._12_4_ * (auVar115._12_4_ + auVar90._12_4_ * fVar102);
  auVar43._16_4_ = auVar132._16_4_ * (auVar115._16_4_ + auVar90._16_4_ * fVar104);
  auVar43._20_4_ = auVar132._20_4_ * (auVar115._20_4_ + auVar90._20_4_ * fVar106);
  auVar43._24_4_ = auVar132._24_4_ * (auVar115._24_4_ + auVar90._24_4_ * fVar108);
  auVar43._28_4_ = auVar115._28_4_ + fVar105;
  auVar44._4_4_ = auVar88._4_4_ * auVar88._4_4_;
  auVar44._0_4_ = auVar88._0_4_ * auVar88._0_4_;
  auVar44._8_4_ = auVar88._8_4_ * auVar88._8_4_;
  auVar44._12_4_ = auVar88._12_4_ * auVar88._12_4_;
  auVar44._16_4_ = auVar88._16_4_ * auVar88._16_4_;
  auVar44._20_4_ = auVar88._20_4_ * auVar88._20_4_;
  auVar44._24_4_ = auVar88._24_4_ * auVar88._24_4_;
  auVar44._28_4_ = auVar90._28_4_;
  auVar115 = vsubps_avx(auVar44,auVar43);
  auVar96 = ZEXT1232(ZEXT412(0)) << 0x20;
  auVar90 = vcmpps_avx(auVar115,auVar96,5);
  auVar144 = auVar90 & ~auVar77;
  if ((((((((auVar144 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar144 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar144 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar144 >> 0x7f,0) != '\0') ||
        (auVar144 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321(auVar144 >> 0xbf,0) != '\0') ||
      (auVar144 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar144[0x1f] < '\0')
  {
    auVar90 = vandnps_avx(auVar77,auVar90);
    auVar110 = vpackssdw_avx(auVar90._0_16_,auVar90._16_16_);
    auVar77 = vsubps_avx(auVar79,auVar125);
    auVar92 = vsubps_avx(auVar141,auVar92);
    auVar111 = vsubps_avx(auVar130,auVar111);
    auVar112._2_2_ = 0;
    auVar112._0_2_ = uVar3;
    auVar115 = vsqrtps_avx(auVar115);
    auVar112._4_2_ = uVar3;
    auVar112._6_2_ = 0;
    auVar112._8_2_ = uVar3;
    auVar112._10_2_ = 0;
    auVar112._12_2_ = uVar3;
    auVar112._14_2_ = 0;
    auVar112._16_2_ = uVar3;
    auVar112._18_2_ = 0;
    auVar112._20_2_ = uVar3;
    auVar112._22_2_ = 0;
    auVar112._24_2_ = uVar3;
    auVar112._26_2_ = 0;
    auVar112._28_2_ = uVar3;
    auVar112._30_2_ = 0;
    auVar90 = vrcpps_avx(auVar132);
    auVar177._8_4_ = 0x3f800000;
    auVar177._0_8_ = 0x3f8000003f800000;
    auVar177._12_4_ = 0x3f800000;
    auVar177._16_4_ = 0x3f800000;
    auVar177._20_4_ = 0x3f800000;
    auVar177._24_4_ = 0x3f800000;
    auVar177._28_4_ = 0x3f800000;
    auVar31 = vfnmadd213ps_fma(auVar90,auVar132,auVar177);
    auVar183._8_4_ = 0x7fffffff;
    auVar183._0_8_ = 0x7fffffff7fffffff;
    auVar183._12_4_ = 0x7fffffff;
    auVar183._16_4_ = 0x7fffffff;
    auVar183._20_4_ = 0x7fffffff;
    auVar183._24_4_ = 0x7fffffff;
    auVar183._28_4_ = 0x7fffffff;
    auVar31 = vfmadd132ps_fma(ZEXT1632(auVar31),auVar90,auVar90);
    auVar90 = vandps_avx(auVar132,auVar183);
    auVar155._8_4_ = 0x219392ef;
    auVar155._0_8_ = 0x219392ef219392ef;
    auVar155._12_4_ = 0x219392ef;
    auVar155._16_4_ = 0x219392ef;
    auVar155._20_4_ = 0x219392ef;
    auVar155._24_4_ = 0x219392ef;
    auVar155._28_4_ = 0x219392ef;
    auVar90 = vcmpps_avx(auVar90,auVar155,2);
    uVar74 = CONCAT44(auVar88._4_4_,auVar88._0_4_);
    auVar184._0_8_ = uVar74 ^ 0x8000000080000000;
    auVar184._8_4_ = -auVar88._8_4_;
    auVar184._12_4_ = -auVar88._12_4_;
    auVar184._16_4_ = -auVar88._16_4_;
    auVar184._20_4_ = -auVar88._20_4_;
    auVar184._24_4_ = -auVar88._24_4_;
    auVar184._28_4_ = -auVar88._28_4_;
    auVar132 = vsubps_avx(auVar184,auVar115);
    auVar144 = vsubps_avx(auVar115,auVar88);
    auVar156._8_4_ = 0xff800000;
    auVar156._0_8_ = 0xff800000ff800000;
    auVar156._12_4_ = 0xff800000;
    auVar156._16_4_ = 0xff800000;
    auVar156._20_4_ = 0xff800000;
    auVar156._24_4_ = 0xff800000;
    auVar156._28_4_ = 0xff800000;
    auVar45._4_4_ = auVar132._4_4_ * auVar31._4_4_;
    auVar45._0_4_ = auVar132._0_4_ * auVar31._0_4_;
    auVar45._8_4_ = auVar132._8_4_ * auVar31._8_4_;
    auVar45._12_4_ = auVar132._12_4_ * auVar31._12_4_;
    auVar45._16_4_ = auVar132._16_4_ * 0.0;
    auVar45._20_4_ = auVar132._20_4_ * 0.0;
    auVar45._24_4_ = auVar132._24_4_ * 0.0;
    auVar45._28_4_ = auVar115._28_4_;
    auVar115 = vblendvps_avx(auVar45,auVar156,auVar90);
    auVar46._4_4_ = auVar31._4_4_ * auVar144._4_4_;
    auVar46._0_4_ = auVar31._0_4_ * auVar144._0_4_;
    auVar46._8_4_ = auVar31._8_4_ * auVar144._8_4_;
    auVar46._12_4_ = auVar31._12_4_ * auVar144._12_4_;
    auVar46._16_4_ = auVar144._16_4_ * 0.0;
    auVar46._20_4_ = auVar144._20_4_ * 0.0;
    auVar46._24_4_ = auVar144._24_4_ * 0.0;
    auVar46._28_4_ = auVar144._28_4_;
    auVar181._8_4_ = 0x7f800000;
    auVar181._0_8_ = 0x7f8000007f800000;
    auVar181._12_4_ = 0x7f800000;
    auVar181._16_4_ = 0x7f800000;
    auVar181._20_4_ = 0x7f800000;
    auVar181._24_4_ = 0x7f800000;
    auVar181._28_4_ = 0x7f800000;
    auVar132 = vblendvps_avx(auVar46,auVar181,auVar90);
    auVar125 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
    auVar90 = vpand_avx2(auVar112,auVar125);
    auVar90 = vpcmpeqd_avx2(auVar90,auVar96);
    auVar31 = vpackssdw_avx(auVar90._0_16_,auVar90._16_16_);
    auVar142._0_4_ = fVar162 + fVar167 * auVar115._0_4_;
    auVar142._4_4_ = fVar163 + fVar170 * auVar115._4_4_;
    auVar142._8_4_ = fVar164 + fVar171 * auVar115._8_4_;
    auVar142._12_4_ = fVar95 + fVar172 * auVar115._12_4_;
    auVar142._16_4_ = auVar115._16_4_ * 0.0 + 0.0;
    auVar142._20_4_ = auVar115._20_4_ * 0.0 + 0.0;
    auVar142._24_4_ = auVar115._24_4_ * 0.0 + 0.0;
    auVar142._28_4_ = 0;
    auVar96 = ZEXT1232(ZEXT412(0)) << 0x20;
    auVar90 = vcmpps_avx(auVar142,auVar96,6);
    auVar144 = vcmpps_avx(auVar142,auVar122,1);
    auVar90 = vandps_avx(auVar144,auVar90);
    auVar33 = vpackssdw_avx(auVar90._0_16_,auVar90._16_16_);
    auVar33 = vpand_avx(auVar33,auVar110);
    auVar90 = vpmovsxwd_avx2(auVar33);
    local_400 = vblendvps_avx(auVar181,auVar115,auVar90);
    auVar113._2_2_ = 0;
    auVar113._0_2_ = uVar2;
    auVar113._4_2_ = uVar2;
    auVar113._6_2_ = 0;
    auVar113._8_2_ = uVar2;
    auVar113._10_2_ = 0;
    auVar113._12_2_ = uVar2;
    auVar113._14_2_ = 0;
    auVar113._16_2_ = uVar2;
    auVar113._18_2_ = 0;
    auVar113._20_2_ = uVar2;
    auVar113._22_2_ = 0;
    auVar113._24_2_ = uVar2;
    auVar113._26_2_ = 0;
    auVar113._28_2_ = uVar2;
    auVar113._30_2_ = 0;
    auVar90 = vpand_avx2(auVar113,auVar125);
    auVar144 = vpcmpeqd_avx2(auVar90,auVar96);
    local_440._0_4_ = fVar162 + fVar167 * auVar132._0_4_;
    local_440._4_4_ = fVar163 + fVar170 * auVar132._4_4_;
    fStack_438 = fVar164 + fVar171 * auVar132._8_4_;
    fStack_434 = fVar95 + fVar172 * auVar132._12_4_;
    fStack_430 = auVar132._16_4_ * 0.0 + 0.0;
    fStack_42c = auVar132._20_4_ * 0.0 + 0.0;
    fStack_428 = auVar132._24_4_ * 0.0 + 0.0;
    register0x0000121c = auVar115._28_4_ + 0.0;
    auVar90 = vcmpps_avx(_local_440,auVar96,6);
    auVar115 = vcmpps_avx(_local_440,auVar122,1);
    auVar90 = vandps_avx(auVar115,auVar90);
    auVar33 = vpackssdw_avx(auVar90._0_16_,auVar90._16_16_);
    auVar33 = vpand_avx(auVar33,auVar110);
    auVar90 = vpmovsxwd_avx2(auVar33);
    local_420 = vblendvps_avx(auVar156,auVar132,auVar90);
    auVar33 = vpackssdw_avx(auVar144._0_16_,auVar144._16_16_);
    auVar90 = vrcpps_avx(ZEXT1632(auVar32));
    auVar32 = vfnmadd213ps_fma(auVar90,ZEXT1632(auVar32),auVar177);
    auVar30 = vfmadd132ps_fma(ZEXT1632(auVar32),auVar90,auVar90);
    auVar47._4_4_ = fVar170 * (float)local_540._4_4_;
    auVar47._0_4_ = fVar167 * (float)local_540._0_4_;
    auVar47._8_4_ = fVar171 * fStack_538;
    auVar47._12_4_ = fVar172 * fStack_534;
    auVar47._16_4_ = fStack_530 * 0.0;
    auVar47._20_4_ = fStack_52c * 0.0;
    auVar47._24_4_ = fStack_528 * 0.0;
    auVar47._28_4_ = auVar90._28_4_;
    auVar131._0_4_ = fVar187 * fVar162;
    auVar131._4_4_ = fVar187 * fVar163;
    auVar131._8_4_ = fVar187 * fVar164;
    auVar131._12_4_ = fVar187 * fVar95;
    auVar131._16_4_ = fVar187 * 0.0;
    auVar131._20_4_ = fVar187 * 0.0;
    auVar131._24_4_ = fVar187 * 0.0;
    auVar131._28_4_ = 0;
    auVar90 = vsubps_avx(auVar47,auVar131);
    auVar48._4_4_ = fVar170 * (float)local_560._4_4_;
    auVar48._0_4_ = fVar167 * (float)local_560._0_4_;
    auVar48._8_4_ = fVar171 * fStack_558;
    auVar48._12_4_ = fVar172 * fStack_554;
    auVar48._16_4_ = fStack_550 * 0.0;
    auVar48._20_4_ = fStack_54c * 0.0;
    auVar48._24_4_ = fStack_548 * 0.0;
    auVar48._28_4_ = 0;
    auVar188._0_4_ = fVar191 * fVar162;
    auVar188._4_4_ = fVar191 * fVar163;
    auVar188._8_4_ = fVar191 * fVar164;
    auVar188._12_4_ = fVar191 * fVar95;
    auVar188._16_4_ = fVar191 * 0.0;
    auVar188._20_4_ = fVar191 * 0.0;
    auVar188._24_4_ = fVar191 * 0.0;
    auVar188._28_4_ = 0;
    auVar115 = vsubps_avx(auVar48,auVar188);
    auVar49._4_4_ = fVar170 * fVar16;
    auVar49._0_4_ = fVar167 * fVar13;
    auVar49._8_4_ = fVar171 * fVar19;
    auVar49._12_4_ = fVar172 * fVar22;
    auVar49._16_4_ = fVar25 * 0.0;
    auVar49._20_4_ = fVar27 * 0.0;
    auVar49._24_4_ = fVar29 * 0.0;
    auVar49._28_4_ = 0;
    auVar50._4_4_ = local_3a0 * fVar163;
    auVar50._0_4_ = local_3a0 * fVar162;
    auVar50._8_4_ = local_3a0 * fVar164;
    auVar50._12_4_ = local_3a0 * fVar95;
    auVar50._16_4_ = local_3a0 * 0.0;
    auVar50._20_4_ = local_3a0 * 0.0;
    auVar50._24_4_ = local_3a0 * 0.0;
    auVar50._28_4_ = 0;
    auVar132 = vsubps_avx(auVar49,auVar50);
    auVar51._4_4_ = auVar132._4_4_ * auVar132._4_4_;
    auVar51._0_4_ = auVar132._0_4_ * auVar132._0_4_;
    auVar51._8_4_ = auVar132._8_4_ * auVar132._8_4_;
    auVar51._12_4_ = auVar132._12_4_ * auVar132._12_4_;
    auVar51._16_4_ = auVar132._16_4_ * auVar132._16_4_;
    auVar51._20_4_ = auVar132._20_4_ * auVar132._20_4_;
    auVar51._24_4_ = auVar132._24_4_ * auVar132._24_4_;
    auVar51._28_4_ = auVar132._28_4_;
    auVar32 = vfmadd231ps_fma(auVar51,auVar115,auVar115);
    auVar32 = vfmadd231ps_fma(ZEXT1632(auVar32),auVar90,auVar90);
    auVar52._4_4_ = fVar84 * fVar190 * fVar190;
    auVar52._0_4_ = fVar75 * fVar186 * fVar186;
    auVar52._8_4_ = fVar85 * fVar192 * fVar192;
    auVar52._12_4_ = fVar86 * fVar194 * fVar194;
    auVar52._16_4_ = fVar195 * fVar195 * 0.0;
    auVar52._20_4_ = fVar197 * fVar197 * 0.0;
    auVar52._24_4_ = fVar198 * fVar198 * 0.0;
    auVar52._28_4_ = fVar107;
    auVar90 = vcmpps_avx(ZEXT1632(auVar32),auVar52,1);
    auVar32 = vpackssdw_avx(auVar90._0_16_,auVar90._16_16_);
    auVar32 = vpand_avx(auVar33,auVar32);
    auVar173._8_4_ = 0x7f800000;
    auVar173._0_8_ = 0x7f8000007f800000;
    auVar173._12_4_ = 0x7f800000;
    auVar173._16_4_ = 0x7f800000;
    auVar173._20_4_ = 0x7f800000;
    auVar173._24_4_ = 0x7f800000;
    auVar173._28_4_ = 0x7f800000;
    auVar53._4_4_ = auVar30._4_4_ * -fVar163;
    auVar53._0_4_ = auVar30._0_4_ * -fVar162;
    auVar53._8_4_ = auVar30._8_4_ * -fVar164;
    auVar53._12_4_ = auVar30._12_4_ * -fVar95;
    auVar53._16_4_ = 0x80000000;
    auVar53._20_4_ = 0x80000000;
    auVar53._24_4_ = 0x80000000;
    auVar53._28_4_ = 0x80000000;
    auVar32 = vpand_avx(auVar110,auVar32);
    auVar90 = vpmovsxwd_avx2(auVar32);
    local_640 = vblendvps_avx(auVar173,auVar53,auVar90);
    local_600._0_4_ = auVar111._0_4_;
    local_600._4_4_ = auVar111._4_4_;
    fStack_5f8 = auVar111._8_4_;
    fStack_5f4 = auVar111._12_4_;
    fStack_5f0 = auVar111._16_4_;
    fStack_5ec = auVar111._20_4_;
    fStack_5e8 = auVar111._24_4_;
    uStack_5e4 = auVar111._28_4_;
    auVar54._4_4_ = (float)local_600._4_4_ * fVar15;
    auVar54._0_4_ = (float)local_600._0_4_ * fVar199;
    auVar54._8_4_ = fStack_5f8 * fVar18;
    auVar54._12_4_ = fStack_5f4 * fVar21;
    auVar54._16_4_ = fStack_5f0 * fVar24;
    auVar54._20_4_ = fStack_5ec * fVar26;
    auVar54._24_4_ = fStack_5e8 * fVar28;
    auVar54._28_4_ = auVar90._28_4_;
    auVar32 = vfmadd231ps_fma(auVar54,auVar92,local_6e0);
    auVar32 = vfmadd231ps_fma(ZEXT1632(auVar32),auVar77,local_3e0);
    auVar55._4_4_ = fVar170 * auVar77._4_4_;
    auVar55._0_4_ = fVar167 * auVar77._0_4_;
    auVar55._8_4_ = fVar171 * auVar77._8_4_;
    auVar55._12_4_ = fVar172 * auVar77._12_4_;
    auVar55._16_4_ = auVar77._16_4_ * 0.0;
    auVar55._20_4_ = auVar77._20_4_ * 0.0;
    auVar55._24_4_ = auVar77._24_4_ * 0.0;
    auVar55._28_4_ = 0x80000000;
    auVar56._4_4_ = fVar170 * auVar92._4_4_;
    auVar56._0_4_ = fVar167 * auVar92._0_4_;
    auVar56._8_4_ = fVar171 * auVar92._8_4_;
    auVar56._12_4_ = fVar172 * auVar92._12_4_;
    auVar56._16_4_ = auVar92._16_4_ * 0.0;
    auVar56._20_4_ = auVar92._20_4_ * 0.0;
    auVar56._24_4_ = auVar92._24_4_ * 0.0;
    auVar56._28_4_ = auVar77._28_4_;
    auVar57._4_4_ = fVar170 * (float)local_600._4_4_;
    auVar57._0_4_ = fVar167 * (float)local_600._0_4_;
    auVar57._8_4_ = fVar171 * fStack_5f8;
    auVar57._12_4_ = fVar172 * fStack_5f4;
    auVar57._16_4_ = fStack_5f0 * 0.0;
    auVar57._20_4_ = fStack_5ec * 0.0;
    auVar57._24_4_ = fStack_5e8 * 0.0;
    auVar57._28_4_ = auVar92._28_4_;
    fVar162 = auVar32._0_4_;
    fVar163 = auVar32._4_4_;
    auVar58._4_4_ = fVar187 * fVar163;
    auVar58._0_4_ = fVar187 * fVar162;
    fVar164 = auVar32._8_4_;
    auVar58._8_4_ = fVar187 * fVar164;
    fVar95 = auVar32._12_4_;
    auVar58._12_4_ = fVar187 * fVar95;
    auVar58._16_4_ = fVar187 * 0.0;
    auVar58._20_4_ = fVar187 * 0.0;
    auVar58._24_4_ = fVar187 * 0.0;
    auVar58._28_4_ = uStack_5e4;
    auVar90 = vsubps_avx(auVar55,auVar58);
    auVar59._4_4_ = fVar191 * fVar163;
    auVar59._0_4_ = fVar191 * fVar162;
    auVar59._8_4_ = fVar191 * fVar164;
    auVar59._12_4_ = fVar191 * fVar95;
    auVar59._16_4_ = fVar191 * 0.0;
    auVar59._20_4_ = fVar191 * 0.0;
    auVar59._24_4_ = fVar191 * 0.0;
    auVar59._28_4_ = uStack_5e4;
    auVar115 = vsubps_avx(auVar56,auVar59);
    auVar60._4_4_ = local_3a0 * fVar163;
    auVar60._0_4_ = local_3a0 * fVar162;
    auVar60._8_4_ = local_3a0 * fVar164;
    auVar60._12_4_ = local_3a0 * fVar95;
    auVar60._16_4_ = local_3a0 * 0.0;
    auVar60._20_4_ = local_3a0 * 0.0;
    auVar60._24_4_ = local_3a0 * 0.0;
    auVar60._28_4_ = uStack_5e4;
    auVar178._8_4_ = 0x3f800000;
    auVar178._0_8_ = 0x3f8000003f800000;
    auVar178._12_4_ = 0x3f800000;
    auVar178._16_4_ = 0x3f800000;
    auVar178._20_4_ = 0x3f800000;
    auVar178._24_4_ = 0x3f800000;
    auVar178._28_4_ = 0x3f800000;
    auVar132 = vsubps_avx(auVar57,auVar60);
    auVar61._4_4_ = auVar132._4_4_ * auVar132._4_4_;
    auVar61._0_4_ = auVar132._0_4_ * auVar132._0_4_;
    auVar61._8_4_ = auVar132._8_4_ * auVar132._8_4_;
    auVar61._12_4_ = auVar132._12_4_ * auVar132._12_4_;
    auVar61._16_4_ = auVar132._16_4_ * auVar132._16_4_;
    auVar61._20_4_ = auVar132._20_4_ * auVar132._20_4_;
    auVar61._24_4_ = auVar132._24_4_ * auVar132._24_4_;
    auVar61._28_4_ = auVar132._28_4_;
    auVar32 = vfmadd231ps_fma(auVar61,auVar115,auVar115);
    auVar32 = vfmadd231ps_fma(ZEXT1632(auVar32),auVar90,auVar90);
    local_5e0._0_4_ = auVar87._0_4_;
    local_5e0._4_4_ = auVar87._4_4_;
    fStack_5d8 = auVar87._8_4_;
    fStack_5d4 = auVar87._12_4_;
    fStack_5d0 = auVar87._16_4_;
    fStack_5cc = auVar87._20_4_;
    fStack_5c8 = auVar87._24_4_;
    auVar62._4_4_ = fVar84 * (float)local_5e0._4_4_ * (float)local_5e0._4_4_;
    auVar62._0_4_ = fVar75 * (float)local_5e0._0_4_ * (float)local_5e0._0_4_;
    auVar62._8_4_ = fVar85 * fStack_5d8 * fStack_5d8;
    auVar62._12_4_ = fVar86 * fStack_5d4 * fStack_5d4;
    auVar62._16_4_ = fStack_5d0 * fStack_5d0 * 0.0;
    auVar62._20_4_ = fStack_5cc * fStack_5cc * 0.0;
    auVar62._24_4_ = fStack_5c8 * fStack_5c8 * 0.0;
    auVar62._28_4_ = auVar90._28_4_;
    uVar76 = *(undefined4 *)(ray + k * 4 + 0x60);
    auVar80._4_4_ = uVar76;
    auVar80._0_4_ = uVar76;
    auVar80._8_4_ = uVar76;
    auVar80._12_4_ = uVar76;
    auVar80._16_4_ = uVar76;
    auVar80._20_4_ = uVar76;
    auVar80._24_4_ = uVar76;
    auVar80._28_4_ = uVar76;
    auVar90 = vcmpps_avx(ZEXT1632(auVar32),auVar62,1);
    auVar32 = vpackssdw_avx(auVar90._0_16_,auVar90._16_16_);
    auVar31 = vpand_avx(auVar32,auVar31);
    auVar89._0_4_ = auVar30._0_4_ * -fVar162;
    auVar89._4_4_ = auVar30._4_4_ * -fVar163;
    auVar89._8_4_ = auVar30._8_4_ * -fVar164;
    auVar89._12_4_ = auVar30._12_4_ * -fVar95;
    auVar89._16_4_ = 0x80000000;
    auVar89._20_4_ = 0x80000000;
    auVar89._24_4_ = 0x80000000;
    auVar89._28_4_ = 0;
    auVar31 = vpand_avx(auVar110,auVar31);
    auVar90 = vpmovsxwd_avx2(auVar31);
    auVar90 = vblendvps_avx(auVar173,auVar89,auVar90);
    auVar144 = vminps_avx(local_640,auVar90);
    auVar115 = vmaxps_avx(local_640,auVar90);
    auVar96 = vminps_avx(local_400,auVar144);
    auVar132 = vcmpps_avx(auVar96,auVar144,0);
    auVar90 = vcmpps_avx(auVar173,auVar115,0);
    auVar157._8_4_ = 0xff800000;
    auVar157._0_8_ = 0xff800000ff800000;
    auVar157._12_4_ = 0xff800000;
    auVar157._16_4_ = 0xff800000;
    auVar157._20_4_ = 0xff800000;
    auVar157._24_4_ = 0xff800000;
    auVar157._28_4_ = 0xff800000;
    auVar90 = vblendvps_avx(auVar115,auVar157,auVar90);
    auVar115 = vcmpps_avx(auVar173,auVar144,0);
    auVar115 = vblendvps_avx(auVar144,auVar157,auVar115);
    auVar90 = vblendvps_avx(auVar115,auVar90,auVar132);
    local_80 = vmaxps_avx(local_420,auVar90);
    auVar97._0_4_ = fVar127 + auVar96._0_4_;
    auVar97._4_4_ = fVar135 + auVar96._4_4_;
    auVar97._8_4_ = fVar136 + auVar96._8_4_;
    auVar97._12_4_ = fVar137 + auVar96._12_4_;
    auVar97._16_4_ = auVar96._16_4_ + 0.0;
    auVar97._20_4_ = auVar96._20_4_ + 0.0;
    auVar97._24_4_ = auVar96._24_4_ + 0.0;
    auVar97._28_4_ = auVar96._28_4_ + 0.0;
    uVar76 = *(undefined4 *)(ray + k * 4 + 0x100);
    auVar114._4_4_ = uVar76;
    auVar114._0_4_ = uVar76;
    auVar114._8_4_ = uVar76;
    auVar114._12_4_ = uVar76;
    auVar114._16_4_ = uVar76;
    auVar114._20_4_ = uVar76;
    auVar114._24_4_ = uVar76;
    auVar114._28_4_ = uVar76;
    auVar90 = vcmpps_avx(auVar80,auVar97,2);
    auVar115 = vcmpps_avx(auVar97,auVar114,2);
    auVar90 = vandps_avx(auVar90,auVar115);
    auVar115 = vcmpps_avx(auVar173,auVar96,4);
    auVar90 = vandps_avx(auVar90,auVar115);
    auVar31 = vpackssdw_avx(auVar90._0_16_,auVar90._16_16_);
    local_5a0 = vpand_avx(auVar110,auVar31);
    local_5e0._0_4_ = fVar127 + local_80._0_4_;
    local_5e0._4_4_ = fVar135 + local_80._4_4_;
    fStack_5d8 = fVar136 + local_80._8_4_;
    fStack_5d4 = fVar137 + local_80._12_4_;
    fStack_5d0 = local_80._16_4_ + 0.0;
    fStack_5cc = local_80._20_4_ + 0.0;
    fStack_5c8 = local_80._24_4_ + 0.0;
    register0x0000129c = local_80._28_4_ + 0.0;
    auVar90 = vcmpps_avx(auVar80,_local_5e0,2);
    auVar115 = vcmpps_avx(_local_5e0,auVar114,2);
    auVar90 = vandps_avx(auVar90,auVar115);
    auVar115 = vcmpps_avx(auVar157,local_80,4);
    auVar90 = vandps_avx(auVar90,auVar115);
    auVar31 = vpackssdw_avx(auVar90._0_16_,auVar90._16_16_);
    local_5c0 = vpand_avx(auVar110,auVar31);
    local_2f0 = vpor_avx(local_5a0,local_5c0);
    local_6c0 = vpmovsxwd_avx2(local_2f0);
    if ((((((((local_6c0 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (local_6c0 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (local_6c0 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(local_6c0 >> 0x7f,0) != '\0') ||
          (local_6c0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(local_6c0 >> 0xbf,0) != '\0') ||
        (local_6c0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_6c0[0x1f] < '\0') {
      auStack_5b0 = auVar92._16_16_;
      auStack_590 = auVar77._16_16_;
      local_340 = local_6c0;
      auVar90 = vpmovzxwd_avx2(local_5a0);
      auVar115 = vpslld_avx2(auVar90,0x1f);
      auVar90 = vblendvps_avx(local_80,auVar96,auVar115);
      auVar115 = vblendvps_avx(_local_440,auVar142,auVar115);
      auVar96 = vrcpps_avx(auVar122);
      auVar32 = vfnmadd213ps_fma(auVar96,auVar122,auVar178);
      fVar186 = fVar193 * fVar14 * fVar186;
      fVar190 = fVar160 * fVar17 * fVar190;
      fVar192 = fVar196 * fVar20 * fVar192;
      fVar194 = fVar161 * fVar23 * fVar194;
      fVar195 = fVar99 * 0.0 * fVar195;
      fVar197 = fVar101 * 0.0 * fVar197;
      fVar198 = fVar103 * 0.0 * fVar198;
      local_360._0_4_ = fVar186 * local_3e0._0_4_;
      local_360._4_4_ = fVar190 * local_3e0._4_4_;
      fVar160 = local_3e0._8_4_;
      fVar161 = local_3e0._12_4_;
      fVar162 = local_3e0._16_4_;
      fVar163 = local_3e0._20_4_;
      fVar164 = local_3e0._24_4_;
      local_a0 = local_3e0._0_4_ * fVar138;
      fStack_9c = local_3e0._4_4_ * fVar147;
      auVar132 = vcmpps_avx(local_400,auVar90,0);
      auVar144 = vcmpps_avx(auVar90,local_420,0);
      auVar132 = vorps_avx(auVar132,auVar144);
      auVar31 = vpackssdw_avx(auVar132._0_16_,auVar132._16_16_);
      auVar31 = vpand_avx(auVar110,auVar31);
      auVar122 = vpmovsxwd_avx2(auVar31);
      auVar132 = vcmpps_avx(local_640,auVar90,0);
      auVar31 = vpackssdw_avx(auVar132._0_16_,auVar132._16_16_);
      auVar110 = vpand_avx(auVar110,auVar31);
      auVar77 = vpmovsxwd_avx2(auVar110);
      fVar95 = auVar90._0_4_;
      fVar99 = auVar90._4_4_;
      fVar101 = auVar90._8_4_;
      fVar103 = auVar90._12_4_;
      fVar105 = auVar90._16_4_;
      fVar107 = auVar90._20_4_;
      fVar75 = auVar90._24_4_;
      fStack_358 = fVar192 * fVar160;
      fStack_354 = fVar194 * fVar161;
      fStack_350 = fVar195 * fVar162;
      fStack_34c = fVar197 * fVar163;
      fStack_348 = fVar198 * fVar164;
      fStack_344 = 0.0;
      auVar116._0_4_ =
           (float)local_360._0_4_ + fVar109 * (fVar95 * fVar187 + (float)local_540._0_4_);
      auVar116._4_4_ =
           (float)local_360._4_4_ + fVar119 * (fVar99 * fVar187 + (float)local_540._4_4_);
      auVar116._8_4_ = fVar192 * fVar160 + fVar120 * (fVar101 * fVar187 + fStack_538);
      auVar116._12_4_ = fVar194 * fVar161 + fVar121 * (fVar103 * fVar187 + fStack_534);
      auVar116._16_4_ = fVar195 * fVar162 + (fVar105 * fVar187 + fStack_530) * 0.0;
      auVar116._20_4_ = fVar197 * fVar163 + (fVar107 * fVar187 + fStack_52c) * 0.0;
      auVar116._24_4_ = fVar198 * fVar164 + (fVar75 * fVar187 + fStack_528) * 0.0;
      auVar116._28_4_ = local_540._28_4_ + 0.0 + 0.0;
      fStack_98 = fVar160 * fVar148;
      fStack_94 = fVar161 * fVar149;
      fStack_90 = fVar162 * fVar150;
      fStack_8c = fVar163 * fVar151;
      fStack_88 = fVar164 * fVar152;
      uStack_84 = 0x3f800000;
      fVar187 = auVar115._0_4_;
      auVar168._0_4_ = local_a0 * fVar187;
      fVar193 = auVar115._4_4_;
      auVar168._4_4_ = fStack_9c * fVar193;
      fVar196 = auVar115._8_4_;
      auVar168._8_4_ = fVar160 * fVar148 * fVar196;
      fVar14 = auVar115._12_4_;
      auVar168._12_4_ = fVar161 * fVar149 * fVar14;
      fVar17 = auVar115._16_4_;
      auVar168._16_4_ = fVar162 * fVar150 * fVar17;
      fVar20 = auVar115._20_4_;
      auVar168._20_4_ = fVar163 * fVar151 * fVar20;
      fVar23 = auVar115._24_4_;
      auVar168._24_4_ = fVar164 * fVar152 * fVar23;
      auVar168._28_4_ = 0;
      auVar144 = vsubps_avx(auVar116,auVar168);
      local_100._0_8_ = local_3e0._0_8_ ^ 0x8000000080000000;
      local_100._8_4_ = -fVar160;
      local_100._12_4_ = -fVar161;
      local_100._16_4_ = -fVar162;
      local_100._20_4_ = -fVar163;
      local_100._24_4_ = -fVar164;
      local_100._28_4_ = -fVar36;
      auVar132 = vblendvps_avx(local_3e0,local_100,auVar77);
      local_620 = vblendvps_avx(auVar132,auVar144,auVar122);
      auVar110 = vfmadd132ps_fma(ZEXT1632(auVar32),auVar96,auVar96);
      local_e0 = local_6e0._0_4_ * fVar186;
      fStack_dc = local_6e0._4_4_ * fVar190;
      fVar160 = local_6e0._8_4_;
      fVar161 = local_6e0._12_4_;
      fVar162 = local_6e0._16_4_;
      fVar163 = local_6e0._20_4_;
      fStack_c4 = local_620._28_4_;
      fVar164 = local_6e0._24_4_;
      fStack_d8 = fVar160 * fVar192;
      fStack_d4 = fVar161 * fVar194;
      fStack_d0 = fVar162 * fVar195;
      fStack_cc = fVar163 * fVar197;
      fStack_c8 = fVar164 * fVar198;
      auVar117._0_4_ = local_e0 + fVar109 * (fVar191 * fVar95 + (float)local_560._0_4_);
      auVar117._4_4_ = fStack_dc + fVar119 * (fVar191 * fVar99 + (float)local_560._4_4_);
      auVar117._8_4_ = fVar160 * fVar192 + fVar120 * (fVar191 * fVar101 + fStack_558);
      auVar117._12_4_ = fVar161 * fVar194 + fVar121 * (fVar191 * fVar103 + fStack_554);
      auVar117._16_4_ = fVar162 * fVar195 + (fVar191 * fVar105 + fStack_550) * 0.0;
      auVar117._20_4_ = fVar163 * fVar197 + (fVar191 * fVar107 + fStack_54c) * 0.0;
      auVar117._24_4_ = fVar164 * fVar198 + (fVar191 * fVar75 + fStack_548) * 0.0;
      auVar117._28_4_ = fStack_c4 + auVar144._28_4_ + fStack_544;
      local_c0 = local_6e0._0_4_ * fVar138;
      fStack_bc = local_6e0._4_4_ * fVar147;
      fStack_b8 = fVar160 * fVar148;
      fStack_b4 = fVar161 * fVar149;
      fStack_b0 = fVar162 * fVar150;
      fStack_ac = fVar163 * fVar151;
      fStack_a8 = fVar164 * fVar152;
      fStack_a4 = fStack_c4;
      auVar63._4_4_ = fStack_bc * fVar193;
      auVar63._0_4_ = local_c0 * fVar187;
      auVar63._8_4_ = fVar160 * fVar148 * fVar196;
      auVar63._12_4_ = fVar161 * fVar149 * fVar14;
      auVar63._16_4_ = fVar162 * fVar150 * fVar17;
      auVar63._20_4_ = fVar163 * fVar151 * fVar20;
      auVar63._24_4_ = fVar164 * fVar152 * fVar23;
      auVar63._28_4_ = auVar96._28_4_;
      auVar144 = vsubps_avx(auVar117,auVar63);
      local_160._0_8_ = local_6e0._0_8_ ^ 0x8000000080000000;
      local_160._8_4_ = -fVar160;
      local_160._12_4_ = -fVar161;
      local_160._16_4_ = -fVar162;
      local_160._20_4_ = -fVar163;
      local_160._24_4_ = -fVar164;
      fStack_104 = local_6e0._28_4_;
      local_160._28_4_ = -fStack_104;
      auVar132 = vblendvps_avx(local_6e0,local_160,auVar77);
      local_480 = vblendvps_avx(auVar132,auVar144,auVar122);
      local_120 = fVar199 * fVar186;
      fStack_11c = fVar15 * fVar190;
      fStack_118 = fVar18 * fVar192;
      fStack_114 = fVar21 * fVar194;
      fStack_110 = fVar24 * fVar195;
      fStack_10c = fVar26 * fVar197;
      fStack_108 = fVar28 * fVar198;
      auVar123._0_4_ = fVar199 * fVar186 + fVar109 * (fVar13 + local_3a0 * fVar95);
      auVar123._4_4_ = fVar15 * fVar190 + fVar119 * (fVar16 + local_3a0 * fVar99);
      auVar123._8_4_ = fVar18 * fVar192 + fVar120 * (fVar19 + local_3a0 * fVar101);
      auVar123._12_4_ = fVar21 * fVar194 + fVar121 * (fVar22 + local_3a0 * fVar103);
      auVar123._16_4_ = fVar24 * fVar195 + (fVar25 + local_3a0 * fVar105) * 0.0;
      auVar123._20_4_ = fVar26 * fVar197 + (fVar27 + local_3a0 * fVar107) * 0.0;
      auVar123._24_4_ = fVar28 * fVar198 + (fVar29 + local_3a0 * fVar75) * 0.0;
      auVar123._28_4_ = fStack_104 + local_3c0._28_4_ + fVar36 + 0.0;
      local_180._0_8_ = local_6a0._0_8_ ^ 0x8000000080000000;
      local_180._8_4_ = -fVar18;
      local_180._12_4_ = -fVar21;
      local_180._16_4_ = -fVar24;
      local_180._20_4_ = -fVar26;
      local_180._24_4_ = -fVar28;
      local_180._28_4_ = local_6a0._28_4_ ^ 0x80000000;
      local_320 = fVar199 * fVar138;
      fStack_31c = fVar15 * fVar147;
      fStack_318 = fVar18 * fVar148;
      fStack_314 = fVar21 * fVar149;
      fStack_310 = fVar24 * fVar150;
      fStack_30c = fVar26 * fVar151;
      fStack_308 = fVar28 * fVar152;
      uStack_304 = auVar132._28_4_;
      auVar64._4_4_ = fVar15 * fVar147 * fVar193;
      auVar64._0_4_ = fVar199 * fVar138 * fVar187;
      auVar64._8_4_ = fVar18 * fVar148 * fVar196;
      auVar64._12_4_ = fVar21 * fVar149 * fVar14;
      auVar64._16_4_ = fVar24 * fVar150 * fVar17;
      auVar64._20_4_ = fVar26 * fVar151 * fVar20;
      auVar64._24_4_ = fVar28 * fVar152 * fVar23;
      auVar64._28_4_ = auVar132._28_4_;
      auVar132 = vblendvps_avx(local_6a0,local_180,auVar77);
      auVar144 = vsubps_avx(auVar123,auVar64);
      local_460 = vblendvps_avx(auVar132,auVar144,auVar122);
      auVar143._8_4_ = 0x3f800000;
      auVar143._0_8_ = 0x3f8000003f800000;
      auVar143._12_4_ = 0x3f800000;
      auVar143._16_4_ = 0x3f800000;
      auVar143._20_4_ = 0x3f800000;
      auVar143._24_4_ = 0x3f800000;
      auVar143._28_4_ = 0x3f800000;
      local_140 = vandnps_avx(auVar77,auVar143);
      _local_600 = ZEXT1632(auVar110);
      auVar65._4_4_ = auVar110._4_4_ * fVar193;
      auVar65._0_4_ = auVar110._0_4_ * fVar187;
      auVar65._8_4_ = auVar110._8_4_ * fVar196;
      auVar65._12_4_ = auVar110._12_4_ * fVar14;
      auVar65._16_4_ = fVar17 * 0.0;
      auVar65._20_4_ = fVar20 * 0.0;
      auVar65._24_4_ = fVar23 * 0.0;
      auVar65._28_4_ = auVar115._28_4_;
      auVar174._8_4_ = 0x7f800000;
      auVar174._0_8_ = 0x7f8000007f800000;
      auVar174._12_4_ = 0x7f800000;
      auVar174._16_4_ = 0x7f800000;
      auVar174._20_4_ = 0x7f800000;
      auVar174._24_4_ = 0x7f800000;
      auVar174._28_4_ = 0x7f800000;
      auVar175 = ZEXT3264(auVar174);
      local_500 = vblendvps_avx(local_140,auVar65,auVar122);
      local_4c0._0_4_ = fVar95 + fVar127;
      local_4c0._4_4_ = fVar99 + fVar135;
      local_4c0._8_4_ = fVar101 + fVar136;
      local_4c0._12_4_ = fVar103 + fVar137;
      local_4c0._16_4_ = fVar105 + 0.0;
      local_4c0._20_4_ = fVar107 + 0.0;
      local_4c0._24_4_ = fVar75 + 0.0;
      local_4c0._28_4_ = auVar90._28_4_ + 0.0;
      auVar185 = ZEXT3264(local_4c0);
      local_4e0 = ZEXT832(0) << 0x20;
      local_4a0 = local_620;
      auVar90 = vpmovzxwd_avx2(local_2f0);
      auVar90 = vpslld_avx2(auVar90,0x1f);
      auVar90 = vblendvps_avx(auVar174,local_4c0,auVar90);
      auVar115 = vshufps_avx(auVar90,auVar90,0xb1);
      auVar115 = vminps_avx(auVar90,auVar115);
      auVar132 = vshufpd_avx(auVar115,auVar115,5);
      auVar115 = vminps_avx(auVar115,auVar132);
      auVar132 = vpermpd_avx2(auVar115,0x4e);
      auVar115 = vminps_avx(auVar115,auVar132);
      auVar115 = vcmpps_avx(auVar90,auVar115,0);
      auVar132 = local_6c0 & auVar115;
      auVar146 = ZEXT3264(local_520);
      auVar182 = ZEXT3264(local_380);
      auVar179 = ZEXT3264(CONCAT428(local_3a0,
                                    CONCAT424(local_3a0,
                                              CONCAT420(local_3a0,
                                                        CONCAT416(local_3a0,
                                                                  CONCAT412(local_3a0,
                                                                            CONCAT48(local_3a0,
                                                                                     CONCAT44(
                                                  local_3a0,local_3a0))))))));
      auVar166 = ZEXT3264(_local_540);
      auVar189 = ZEXT3264(_local_560);
      auVar169 = ZEXT3264(local_3c0);
      auVar159 = ZEXT3264(local_3e0);
      auVar90 = local_6c0;
      if ((((((((auVar132 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar132 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar132 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar132 >> 0x7f,0) != '\0') ||
            (auVar132 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar132 >> 0xbf,0) != '\0') ||
          (auVar132 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar132[0x1f] < '\0') {
        auVar90 = vandps_avx(auVar115,local_6c0);
      }
      auVar115 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
      uVar70 = vmovmskps_avx(auVar90);
      uVar71 = 0;
      for (; (uVar70 & 1) == 0; uVar70 = uVar70 >> 1 | 0x80000000) {
        uVar71 = uVar71 + 1;
      }
      iVar72 = 1 << ((uint)k & 0x1f);
      auVar81._4_4_ = iVar72;
      auVar81._0_4_ = iVar72;
      auVar81._8_4_ = iVar72;
      auVar81._12_4_ = iVar72;
      auVar81._16_4_ = iVar72;
      auVar81._20_4_ = iVar72;
      auVar81._24_4_ = iVar72;
      auVar81._28_4_ = iVar72;
      auVar90 = vpand_avx2(auVar81,auVar115);
      local_580 = vpcmpeqd_avx2(auVar90,auVar115);
      auVar124 = ZEXT3264(local_6e0);
      auVar126 = ZEXT3264(local_6a0);
      auVar134 = ZEXT3264(local_640);
      while( true ) {
        auVar96 = auVar159._0_32_;
        auVar144 = auVar146._0_32_;
        local_710.hit = (RTCHitN *)local_2e0;
        local_710.valid = (int *)local_680;
        auVar122 = auVar166._0_32_;
        auVar176 = auVar179._0_28_;
        auVar180 = auVar182._0_28_;
        auVar115 = auVar126._0_32_;
        auVar90 = auVar124._0_32_;
        auVar132 = auVar134._0_32_;
        auVar87 = auVar189._0_32_;
        auVar77 = auVar169._0_32_;
        uVar74 = (ulong)uVar71;
        uVar71 = local_1a0[uVar74];
        pGVar10 = (pSVar73->geometries).items[uVar71].ptr;
        local_710.ray = (RTCRayN *)ray;
        if ((pGVar10->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
          *(undefined4 *)(local_6c0 + uVar74 * 4) = 0;
        }
        else {
          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
             (pGVar10->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
            uVar76 = *(undefined4 *)(local_500 + uVar74 * 4);
            uVar1 = *(undefined4 *)(local_4e0 + uVar74 * 4);
            local_6e0._0_16_ = ZEXT416(*(uint *)(local_4c0 + uVar74 * 4));
            *(uint *)(ray + k * 4 + 0x100) = *(uint *)(local_4c0 + uVar74 * 4);
            *(undefined4 *)(ray + k * 4 + 0x180) = *(undefined4 *)(local_4a0 + uVar74 * 4);
            *(undefined4 *)(ray + k * 4 + 0x1a0) = *(undefined4 *)(local_480 + uVar74 * 4);
            *(undefined4 *)(ray + k * 4 + 0x1c0) = *(undefined4 *)(local_460 + uVar74 * 4);
            *(undefined4 *)(ray + k * 4 + 0x1e0) = uVar76;
            *(undefined4 *)(ray + k * 4 + 0x200) = uVar1;
            *(uint *)(ray + k * 4 + 0x220) = (line->primIDs).field_0.i[uVar74];
            *(uint *)(ray + k * 4 + 0x240) = uVar71;
            *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
            *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
            goto LAB_0174c001;
          }
          local_280 = *(undefined4 *)(local_500 + uVar74 * 4);
          local_260 = *(undefined4 *)(local_4e0 + uVar74 * 4);
          uVar70 = (line->primIDs).field_0.i[uVar74];
          auVar110._4_4_ = uVar70;
          auVar110._0_4_ = uVar70;
          auVar110._8_4_ = uVar70;
          auVar110._12_4_ = uVar70;
          auVar118._16_4_ = uVar70;
          auVar118._0_16_ = auVar110;
          auVar118._20_4_ = uVar70;
          auVar118._24_4_ = uVar70;
          auVar118._28_4_ = uVar70;
          local_2e0._4_4_ = *(undefined4 *)(local_4a0 + uVar74 * 4);
          local_2c0._4_4_ = *(undefined4 *)(local_480 + uVar74 * 4);
          local_2a0._4_4_ = *(undefined4 *)(local_460 + uVar74 * 4);
          local_220._4_4_ = uVar71;
          local_220._0_4_ = uVar71;
          local_220._8_4_ = uVar71;
          local_220._12_4_ = uVar71;
          local_220._16_4_ = uVar71;
          local_220._20_4_ = uVar71;
          local_220._24_4_ = uVar71;
          local_220._28_4_ = uVar71;
          local_2e0._0_4_ = local_2e0._4_4_;
          local_2e0._8_4_ = local_2e0._4_4_;
          local_2e0._12_4_ = local_2e0._4_4_;
          local_2e0._16_4_ = local_2e0._4_4_;
          local_2e0._20_4_ = local_2e0._4_4_;
          local_2e0._24_4_ = local_2e0._4_4_;
          local_2e0._28_4_ = local_2e0._4_4_;
          local_2c0._0_4_ = local_2c0._4_4_;
          local_2c0._8_4_ = local_2c0._4_4_;
          local_2c0._12_4_ = local_2c0._4_4_;
          local_2c0._16_4_ = local_2c0._4_4_;
          local_2c0._20_4_ = local_2c0._4_4_;
          local_2c0._24_4_ = local_2c0._4_4_;
          local_2c0._28_4_ = local_2c0._4_4_;
          local_2a0._0_4_ = local_2a0._4_4_;
          local_2a0._8_4_ = local_2a0._4_4_;
          local_2a0._12_4_ = local_2a0._4_4_;
          local_2a0._16_4_ = local_2a0._4_4_;
          local_2a0._20_4_ = local_2a0._4_4_;
          local_2a0._24_4_ = local_2a0._4_4_;
          local_2a0._28_4_ = local_2a0._4_4_;
          uStack_27c = local_280;
          uStack_278 = local_280;
          uStack_274 = local_280;
          uStack_270 = local_280;
          uStack_26c = local_280;
          uStack_268 = local_280;
          uStack_264 = local_280;
          uStack_25c = local_260;
          uStack_258 = local_260;
          uStack_254 = local_260;
          uStack_250 = local_260;
          uStack_24c = local_260;
          uStack_248 = local_260;
          uStack_244 = local_260;
          local_240 = auVar118;
          auVar90 = vpcmpeqd_avx2(local_220,local_220);
          uStack_1fc = context->user->instID[0];
          local_200 = uStack_1fc;
          uStack_1f8 = uStack_1fc;
          uStack_1f4 = uStack_1fc;
          uStack_1f0 = uStack_1fc;
          uStack_1ec = uStack_1fc;
          uStack_1e8 = uStack_1fc;
          uStack_1e4 = uStack_1fc;
          uStack_1dc = context->user->instPrimID[0];
          local_1e0 = uStack_1dc;
          uStack_1d8 = uStack_1dc;
          uStack_1d4 = uStack_1dc;
          uStack_1d0 = uStack_1dc;
          uStack_1cc = uStack_1dc;
          uStack_1c8 = uStack_1dc;
          uStack_1c4 = uStack_1dc;
          local_650 = ZEXT416(*(uint *)(ray + k * 4 + 0x100));
          *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_4c0 + uVar74 * 4);
          local_680 = local_580;
          local_710.geometryUserPtr = pGVar10->userPtr;
          local_710.context = context->user;
          local_710.N = 8;
          if (pGVar10->intersectionFilterN != (RTCFilterFunctionN)0x0) {
            local_620 = auVar185._0_32_;
            auVar90 = ZEXT1632(auVar90._0_16_);
            auVar118 = ZEXT1632(auVar110);
            (*pGVar10->intersectionFilterN)(&local_710);
            auVar90 = vpcmpeqd_avx2(auVar90,auVar90);
            auVar185 = ZEXT3264(local_620);
            auVar159 = ZEXT3264(local_3e0);
            auVar169 = ZEXT3264(local_3c0);
            auVar189 = ZEXT3264(_local_560);
            auVar166 = ZEXT3264(_local_540);
            auVar179 = ZEXT3264(CONCAT428(fStack_384,
                                          CONCAT424(fStack_388,
                                                    CONCAT420(fStack_38c,
                                                              CONCAT416(fStack_390,
                                                                        CONCAT412(fStack_394,
                                                                                  CONCAT48(
                                                  fStack_398,CONCAT44(fStack_39c,local_3a0))))))));
            auVar182 = ZEXT3264(local_380);
            auVar146 = ZEXT3264(local_520);
            auVar175 = ZEXT3264(CONCAT428(0x7f800000,
                                          CONCAT424(0x7f800000,
                                                    CONCAT420(0x7f800000,
                                                              CONCAT416(0x7f800000,
                                                                        CONCAT412(0x7f800000,
                                                                                  CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
          }
          auVar132 = vpcmpeqd_avx2(local_680,_DAT_01faff00);
          auVar115 = auVar90 & ~auVar132;
          if ((((((((auVar115 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar115 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar115 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar115 >> 0x7f,0) == '\0') &&
                (auVar115 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar115 >> 0xbf,0) == '\0') &&
              (auVar115 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar115[0x1f]) {
            auVar132 = auVar132 ^ auVar90;
            auVar124 = ZEXT3264(local_6e0);
            auVar126 = ZEXT3264(local_6a0);
            auVar134 = ZEXT3264(local_640);
          }
          else {
            p_Var12 = context->args->filter;
            auVar124 = ZEXT3264(local_6e0);
            auVar126 = ZEXT3264(local_6a0);
            auVar134 = ZEXT3264(local_640);
            if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar10->field_8).field_0x2 & 0x40) != 0)))) {
              local_620 = auVar185._0_32_;
              auVar90 = ZEXT1632(auVar90._0_16_);
              auVar118 = ZEXT1632(auVar118._0_16_);
              (*p_Var12)(&local_710);
              auVar185 = ZEXT3264(local_620);
              auVar134 = ZEXT3264(local_640);
              auVar126 = ZEXT3264(local_6a0);
              auVar124 = ZEXT3264(local_6e0);
              auVar159 = ZEXT3264(local_3e0);
              auVar169 = ZEXT3264(local_3c0);
              auVar189 = ZEXT3264(_local_560);
              auVar166 = ZEXT3264(_local_540);
              auVar179 = ZEXT3264(CONCAT428(fStack_384,
                                            CONCAT424(fStack_388,
                                                      CONCAT420(fStack_38c,
                                                                CONCAT416(fStack_390,
                                                                          CONCAT412(fStack_394,
                                                                                    CONCAT48(
                                                  fStack_398,CONCAT44(fStack_39c,local_3a0))))))));
              auVar182 = ZEXT3264(local_380);
              auVar146 = ZEXT3264(local_520);
              auVar175 = ZEXT3264(CONCAT428(0x7f800000,
                                            CONCAT424(0x7f800000,
                                                      CONCAT420(0x7f800000,
                                                                CONCAT416(0x7f800000,
                                                                          CONCAT412(0x7f800000,
                                                                                    CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
            }
            auVar144 = vpcmpeqd_avx2(local_680,_DAT_01faff00);
            auVar115 = vpcmpeqd_avx2(auVar118,auVar118);
            auVar132 = auVar144 ^ auVar115;
            auVar90 = vpcmpeqd_avx2(auVar90,auVar90);
            auVar115 = auVar115 & ~auVar144;
            if ((((((((auVar115 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar115 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar115 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar115 >> 0x7f,0) != '\0') ||
                  (auVar115 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar115 >> 0xbf,0) != '\0') ||
                (auVar115 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar115[0x1f] < '\0') {
              auVar144 = auVar144 ^ auVar90;
              auVar90 = vmaskmovps_avx(auVar144,*(undefined1 (*) [32])local_710.hit);
              *(undefined1 (*) [32])(local_710.ray + 0x180) = auVar90;
              auVar90 = vmaskmovps_avx(auVar144,*(undefined1 (*) [32])(local_710.hit + 0x20));
              *(undefined1 (*) [32])(local_710.ray + 0x1a0) = auVar90;
              auVar90 = vmaskmovps_avx(auVar144,*(undefined1 (*) [32])(local_710.hit + 0x40));
              *(undefined1 (*) [32])(local_710.ray + 0x1c0) = auVar90;
              auVar90 = vmaskmovps_avx(auVar144,*(undefined1 (*) [32])(local_710.hit + 0x60));
              *(undefined1 (*) [32])(local_710.ray + 0x1e0) = auVar90;
              auVar90 = vmaskmovps_avx(auVar144,*(undefined1 (*) [32])(local_710.hit + 0x80));
              *(undefined1 (*) [32])(local_710.ray + 0x200) = auVar90;
              auVar90 = vpmaskmovd_avx2(auVar144,*(undefined1 (*) [32])(local_710.hit + 0xa0));
              *(undefined1 (*) [32])(local_710.ray + 0x220) = auVar90;
              auVar90 = vpmaskmovd_avx2(auVar144,*(undefined1 (*) [32])(local_710.hit + 0xc0));
              *(undefined1 (*) [32])(local_710.ray + 0x240) = auVar90;
              auVar90 = vpmaskmovd_avx2(auVar144,*(undefined1 (*) [32])(local_710.hit + 0xe0));
              *(undefined1 (*) [32])(local_710.ray + 0x260) = auVar90;
              auVar90 = vpmaskmovd_avx2(auVar144,*(undefined1 (*) [32])(local_710.hit + 0x100));
              *(undefined1 (*) [32])(local_710.ray + 0x280) = auVar90;
            }
          }
          if ((((((((auVar132 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar132 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar132 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar132 >> 0x7f,0) == '\0') &&
                (auVar132 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar132 >> 0xbf,0) == '\0') &&
              (auVar132 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar132[0x1f]) {
            *(undefined4 *)(ray + k * 4 + 0x100) = local_650._0_4_;
            uVar76 = local_650._0_4_;
          }
          else {
            uVar76 = *(undefined4 *)(ray + k * 4 + 0x100);
          }
          *(undefined4 *)(local_6c0 + uVar74 * 4) = 0;
          auVar82._4_4_ = uVar76;
          auVar82._0_4_ = uVar76;
          auVar82._8_4_ = uVar76;
          auVar82._12_4_ = uVar76;
          auVar82._16_4_ = uVar76;
          auVar82._20_4_ = uVar76;
          auVar82._24_4_ = uVar76;
          auVar82._28_4_ = uVar76;
          auVar90 = vcmpps_avx(auVar185._0_32_,auVar82,2);
          local_6c0 = vandps_avx(auVar90,local_6c0);
        }
        auVar96 = auVar159._0_32_;
        auVar144 = auVar146._0_32_;
        auVar122 = auVar166._0_32_;
        auVar176 = auVar179._0_28_;
        auVar180 = auVar182._0_28_;
        auVar115 = auVar126._0_32_;
        auVar90 = auVar124._0_32_;
        auVar132 = auVar134._0_32_;
        auVar87 = auVar189._0_32_;
        auVar77 = auVar169._0_32_;
        if ((((((((local_6c0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (local_6c0 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (local_6c0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(local_6c0 >> 0x7f,0) == '\0') &&
              (local_6c0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(local_6c0 >> 0xbf,0) == '\0') &&
            (local_6c0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < local_6c0[0x1f]) break;
        auVar90 = vblendvps_avx(auVar175._0_32_,auVar185._0_32_,local_6c0);
        auVar115 = vshufps_avx(auVar90,auVar90,0xb1);
        auVar115 = vminps_avx(auVar90,auVar115);
        auVar132 = vshufpd_avx(auVar115,auVar115,5);
        auVar115 = vminps_avx(auVar115,auVar132);
        auVar132 = vpermpd_avx2(auVar115,0x4e);
        auVar115 = vminps_avx(auVar115,auVar132);
        auVar115 = vcmpps_avx(auVar90,auVar115,0);
        auVar132 = local_6c0 & auVar115;
        auVar90 = local_6c0;
        if ((((((((auVar132 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar132 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar132 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar132 >> 0x7f,0) != '\0') ||
              (auVar132 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar132 >> 0xbf,0) != '\0') ||
            (auVar132 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar132[0x1f] < '\0') {
          auVar90 = vandps_avx(auVar115,local_6c0);
        }
        uVar70 = vmovmskps_avx(auVar90);
        uVar71 = 0;
        for (; (uVar70 & 1) == 0; uVar70 = uVar70 >> 1 | 0x80000000) {
          uVar71 = uVar71 + 1;
        }
      }
      local_6e0._0_16_ = ZEXT416(*(uint *)(ray + k * 4 + 0x100));
LAB_0174c001:
      auVar31 = vpand_avx(local_5c0,local_5a0);
      auVar91._4_4_ = local_6e0._0_4_;
      auVar91._0_4_ = local_6e0._0_4_;
      auVar91._8_4_ = local_6e0._0_4_;
      auVar91._12_4_ = local_6e0._0_4_;
      auVar91._16_4_ = local_6e0._0_4_;
      auVar91._20_4_ = local_6e0._0_4_;
      auVar91._24_4_ = local_6e0._0_4_;
      auVar91._28_4_ = local_6e0._0_4_;
      auVar92 = vcmpps_avx(_local_5e0,auVar91,2);
      auVar110 = vpackssdw_avx(auVar92._0_16_,auVar92._16_16_);
      auVar110 = vpand_avx(auVar110,auVar31);
      auVar92 = vpmovzxwd_avx2(auVar110);
      auVar92 = vpslld_avx2(auVar92,0x1f);
      if ((((((((auVar92 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar92 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar92 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar92 >> 0x7f,0) != '\0') ||
            (auVar92 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar92 >> 0xbf,0) != '\0') ||
          (auVar92 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar92[0x1f] < '\0') {
        auVar111 = vcmpps_avx(local_80,auVar132,0);
        auVar132 = vblendvps_avx(auVar96,local_100,auVar111);
        auVar90 = vblendvps_avx(auVar90,local_160,auVar111);
        auVar115 = vblendvps_avx(auVar115,local_180,auVar111);
        auVar111 = vcmpps_avx(local_80,local_400,0);
        auVar125 = vcmpps_avx(local_80,local_420,0);
        auVar111 = vorps_avx(auVar111,auVar125);
        fVar187 = local_80._0_4_;
        fVar191 = local_80._4_4_;
        fVar193 = local_80._8_4_;
        fVar160 = local_80._12_4_;
        fVar196 = local_80._16_4_;
        fVar161 = local_80._20_4_;
        fVar199 = local_80._24_4_;
        auVar133._0_4_ =
             (float)local_1c0._0_4_ * (auVar122._0_4_ + fVar187 * auVar144._0_4_) +
             (float)local_360._0_4_;
        auVar133._4_4_ =
             (float)local_1c0._4_4_ * (auVar122._4_4_ + fVar191 * auVar144._4_4_) +
             (float)local_360._4_4_;
        auVar133._8_4_ = fStack_1b8 * (auVar122._8_4_ + fVar193 * auVar144._8_4_) + fStack_358;
        auVar133._12_4_ = fStack_1b4 * (auVar122._12_4_ + fVar160 * auVar144._12_4_) + fStack_354;
        auVar133._16_4_ = fStack_1b0 * (auVar122._16_4_ + fVar196 * auVar144._16_4_) + fStack_350;
        auVar133._20_4_ = fStack_1ac * (auVar122._20_4_ + fVar161 * auVar144._20_4_) + fStack_34c;
        auVar133._24_4_ = fStack_1a8 * (auVar122._24_4_ + fVar199 * auVar144._24_4_) + fStack_348;
        auVar133._28_4_ = auVar122._28_4_ + auVar125._28_4_ + fStack_344;
        auVar145._0_4_ =
             (float)local_1c0._0_4_ * (auVar87._0_4_ + auVar180._0_4_ * fVar187) + local_e0;
        auVar145._4_4_ =
             (float)local_1c0._4_4_ * (auVar87._4_4_ + auVar180._4_4_ * fVar191) + fStack_dc;
        auVar145._8_4_ = fStack_1b8 * (auVar87._8_4_ + auVar180._8_4_ * fVar193) + fStack_d8;
        auVar145._12_4_ = fStack_1b4 * (auVar87._12_4_ + auVar180._12_4_ * fVar160) + fStack_d4;
        auVar145._16_4_ = fStack_1b0 * (auVar87._16_4_ + auVar180._16_4_ * fVar196) + fStack_d0;
        auVar145._20_4_ = fStack_1ac * (auVar87._20_4_ + auVar180._20_4_ * fVar161) + fStack_cc;
        auVar145._24_4_ = fStack_1a8 * (auVar87._24_4_ + auVar180._24_4_ * fVar199) + fStack_c8;
        auVar145._28_4_ = auVar87._28_4_ + auVar144._28_4_ + fStack_c4;
        auVar158._0_4_ =
             (float)local_1c0._0_4_ * (auVar77._0_4_ + auVar176._0_4_ * fVar187) + local_120;
        auVar158._4_4_ =
             (float)local_1c0._4_4_ * (auVar77._4_4_ + auVar176._4_4_ * fVar191) + fStack_11c;
        auVar158._8_4_ = fStack_1b8 * (auVar77._8_4_ + auVar176._8_4_ * fVar193) + fStack_118;
        auVar158._12_4_ = fStack_1b4 * (auVar77._12_4_ + auVar176._12_4_ * fVar160) + fStack_114;
        auVar158._16_4_ = fStack_1b0 * (auVar77._16_4_ + auVar176._16_4_ * fVar196) + fStack_110;
        auVar158._20_4_ = fStack_1ac * (auVar77._20_4_ + auVar176._20_4_ * fVar161) + fStack_10c;
        auVar158._24_4_ = fStack_1a8 * (auVar77._24_4_ + auVar176._24_4_ * fVar199) + fStack_108;
        auVar158._28_4_ = auVar77._28_4_ + auVar96._28_4_ + fStack_104;
        auVar66._4_4_ = (float)local_440._4_4_ * fStack_9c;
        auVar66._0_4_ = (float)local_440._0_4_ * local_a0;
        auVar66._8_4_ = fStack_438 * fStack_98;
        auVar66._12_4_ = fStack_434 * fStack_94;
        auVar66._16_4_ = fStack_430 * fStack_90;
        auVar66._20_4_ = fStack_42c * fStack_8c;
        auVar66._24_4_ = fStack_428 * fStack_88;
        auVar66._28_4_ = uStack_1a4;
        auVar144 = vsubps_avx(auVar133,auVar66);
        auVar67._4_4_ = (float)local_440._4_4_ * fStack_bc;
        auVar67._0_4_ = (float)local_440._0_4_ * local_c0;
        auVar67._8_4_ = fStack_438 * fStack_b8;
        auVar67._12_4_ = fStack_434 * fStack_b4;
        auVar67._16_4_ = fStack_430 * fStack_b0;
        auVar67._20_4_ = fStack_42c * fStack_ac;
        auVar67._24_4_ = fStack_428 * fStack_a8;
        auVar67._28_4_ = uStack_1a4;
        auVar96 = vsubps_avx(auVar145,auVar67);
        auVar68._4_4_ = (float)local_440._4_4_ * fStack_31c;
        auVar68._0_4_ = (float)local_440._0_4_ * local_320;
        auVar68._8_4_ = fStack_438 * fStack_318;
        auVar68._12_4_ = fStack_434 * fStack_314;
        auVar68._16_4_ = fStack_430 * fStack_310;
        auVar68._20_4_ = fStack_42c * fStack_30c;
        auVar68._24_4_ = fStack_428 * fStack_308;
        auVar68._28_4_ = uStack_1a4;
        auVar122 = vsubps_avx(auVar158,auVar68);
        local_4a0 = vblendvps_avx(auVar132,auVar144,auVar111);
        local_480 = vblendvps_avx(auVar90,auVar96,auVar111);
        local_460 = vblendvps_avx(auVar115,auVar122,auVar111);
        auVar69._4_4_ = (float)local_440._4_4_ * (float)local_600._4_4_;
        auVar69._0_4_ = (float)local_440._0_4_ * (float)local_600._0_4_;
        auVar69._8_4_ = fStack_438 * fStack_5f8;
        auVar69._12_4_ = fStack_434 * fStack_5f4;
        auVar69._16_4_ = fStack_430 * fStack_5f0;
        auVar69._20_4_ = fStack_42c * fStack_5ec;
        auVar69._24_4_ = fStack_428 * fStack_5e8;
        auVar69._28_4_ = auVar144._28_4_;
        local_500 = vblendvps_avx(local_140,auVar69,auVar111);
        auVar146 = ZEXT864(0) << 0x20;
        local_4e0 = ZEXT832(0) << 0x20;
        local_4c0 = _local_5e0;
        auVar90 = vblendvps_avx(auVar175._0_32_,_local_5e0,auVar92);
        auVar115 = vshufps_avx(auVar90,auVar90,0xb1);
        auVar115 = vminps_avx(auVar90,auVar115);
        auVar132 = vshufpd_avx(auVar115,auVar115,5);
        auVar115 = vminps_avx(auVar115,auVar132);
        auVar132 = vpermpd_avx2(auVar115,0x4e);
        auVar115 = vminps_avx(auVar115,auVar132);
        auVar90 = vcmpps_avx(auVar90,auVar115,0);
        auVar31 = vpackssdw_avx(auVar90._0_16_,auVar90._16_16_);
        auVar110 = vpand_avx(auVar31,auVar110);
        local_6c0 = vpsrad_avx2(auVar92,0x1f);
        pSVar73 = context->scene;
        auVar90 = vpmovzxwd_avx2(auVar110);
        auVar90 = vpslld_avx2(auVar90,0x1f);
        if ((((((((auVar90 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar90 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar90 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar90 >> 0x7f,0) == '\0') &&
              (auVar90 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar90 >> 0xbf,0) == '\0') &&
            (auVar90 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar90[0x1f]) {
          auVar90 = local_6c0;
        }
        uVar70 = vmovmskps_avx(auVar90);
        uVar71 = 0;
        for (; (uVar70 & 1) == 0; uVar70 = uVar70 >> 1 | 0x80000000) {
          uVar71 = uVar71 + 1;
        }
        auVar90 = vpcmpeqd_avx2(auVar122,auVar122);
        auVar159 = ZEXT3264(auVar90);
        do {
          local_710.hit = (RTCHitN *)local_2e0;
          local_710.valid = (int *)local_680;
          uVar74 = (ulong)uVar71;
          local_220._4_4_ = local_1a0[uVar74];
          pGVar10 = (pSVar73->geometries).items[(uint)local_220._4_4_].ptr;
          if ((pGVar10->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
            *(undefined4 *)(local_6c0 + uVar74 * 4) = 0;
          }
          else {
            if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
               (pGVar10->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
              uVar76 = *(undefined4 *)(local_500 + uVar74 * 4);
              uVar1 = *(undefined4 *)(local_4e0 + uVar74 * 4);
              *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_4c0 + uVar74 * 4);
              *(undefined4 *)(ray + k * 4 + 0x180) = *(undefined4 *)(local_4a0 + uVar74 * 4);
              *(undefined4 *)(ray + k * 4 + 0x1a0) = *(undefined4 *)(local_480 + uVar74 * 4);
              *(undefined4 *)(ray + k * 4 + 0x1c0) = *(undefined4 *)(local_460 + uVar74 * 4);
              *(undefined4 *)(ray + k * 4 + 0x1e0) = uVar76;
              *(undefined4 *)(ray + k * 4 + 0x200) = uVar1;
              *(uint *)(ray + k * 4 + 0x220) = (line->primIDs).field_0.i[uVar74];
              *(undefined4 *)(ray + k * 4 + 0x240) = local_220._4_4_;
              *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
              *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
              return;
            }
            local_280 = *(undefined4 *)(local_500 + uVar74 * 4);
            local_260 = *(undefined4 *)(local_4e0 + uVar74 * 4);
            local_240._4_4_ = (line->primIDs).field_0.i[uVar74];
            uVar76 = *(undefined4 *)(local_4a0 + uVar74 * 4);
            local_2e0._4_4_ = uVar76;
            local_2e0._0_4_ = uVar76;
            local_2e0._8_4_ = uVar76;
            local_2e0._12_4_ = uVar76;
            local_2e0._16_4_ = uVar76;
            local_2e0._20_4_ = uVar76;
            local_2e0._24_4_ = uVar76;
            local_2e0._28_4_ = uVar76;
            uVar76 = *(undefined4 *)(local_480 + uVar74 * 4);
            local_2c0._4_4_ = uVar76;
            local_2c0._0_4_ = uVar76;
            local_2c0._8_4_ = uVar76;
            local_2c0._12_4_ = uVar76;
            local_2c0._16_4_ = uVar76;
            local_2c0._20_4_ = uVar76;
            local_2c0._24_4_ = uVar76;
            local_2c0._28_4_ = uVar76;
            uVar76 = *(undefined4 *)(local_460 + uVar74 * 4);
            local_2a0._4_4_ = uVar76;
            local_2a0._0_4_ = uVar76;
            local_2a0._8_4_ = uVar76;
            local_2a0._12_4_ = uVar76;
            local_2a0._16_4_ = uVar76;
            local_2a0._20_4_ = uVar76;
            local_2a0._24_4_ = uVar76;
            local_2a0._28_4_ = uVar76;
            uStack_27c = local_280;
            uStack_278 = local_280;
            uStack_274 = local_280;
            uStack_270 = local_280;
            uStack_26c = local_280;
            uStack_268 = local_280;
            uStack_264 = local_280;
            uStack_25c = local_260;
            uStack_258 = local_260;
            uStack_254 = local_260;
            uStack_250 = local_260;
            uStack_24c = local_260;
            uStack_248 = local_260;
            uStack_244 = local_260;
            local_240._0_4_ = local_240._4_4_;
            local_240._8_4_ = local_240._4_4_;
            local_240._12_4_ = local_240._4_4_;
            local_240._16_4_ = local_240._4_4_;
            local_240._20_4_ = local_240._4_4_;
            local_240._24_4_ = local_240._4_4_;
            local_240._28_4_ = local_240._4_4_;
            local_220._0_4_ = local_220._4_4_;
            local_220._8_4_ = local_220._4_4_;
            local_220._12_4_ = local_220._4_4_;
            local_220._16_4_ = local_220._4_4_;
            local_220._20_4_ = local_220._4_4_;
            local_220._24_4_ = local_220._4_4_;
            local_220._28_4_ = local_220._4_4_;
            uStack_1fc = context->user->instID[0];
            local_200 = uStack_1fc;
            uStack_1f8 = uStack_1fc;
            uStack_1f4 = uStack_1fc;
            uStack_1f0 = uStack_1fc;
            uStack_1ec = uStack_1fc;
            uStack_1e8 = uStack_1fc;
            uStack_1e4 = uStack_1fc;
            uStack_1dc = context->user->instPrimID[0];
            local_1e0 = uStack_1dc;
            uStack_1d8 = uStack_1dc;
            uStack_1d4 = uStack_1dc;
            uStack_1d0 = uStack_1dc;
            uStack_1cc = uStack_1dc;
            uStack_1c8 = uStack_1dc;
            uStack_1c4 = uStack_1dc;
            *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_4c0 + uVar74 * 4);
            local_680 = local_580;
            local_710.geometryUserPtr = pGVar10->userPtr;
            local_710.context = context->user;
            local_710.N = 8;
            local_710.ray = (RTCRayN *)ray;
            if (pGVar10->intersectionFilterN != (RTCFilterFunctionN)0x0) {
              local_6a0._0_8_ = pSVar73;
              auVar90 = ZEXT1632(auVar159._0_16_);
              (*pGVar10->intersectionFilterN)(&local_710);
              auVar90 = vpcmpeqd_avx2(auVar90,auVar90);
              auVar159 = ZEXT3264(auVar90);
              auVar146 = ZEXT1664(ZEXT816(0) << 0x40);
              pSVar73 = (Scene *)local_6a0._0_8_;
            }
            auVar115 = vpcmpeqd_avx2(local_680,auVar146._0_32_);
            auVar90 = auVar159._0_32_ & ~auVar115;
            if ((((((((auVar90 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar90 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar90 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar90 >> 0x7f,0) == '\0') &&
                  (auVar90 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar90 >> 0xbf,0) == '\0') &&
                (auVar90 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar90[0x1f]) {
              auVar115 = auVar159._0_32_ ^ auVar115;
              auVar175 = ZEXT3264(CONCAT428(0x7f800000,
                                            CONCAT424(0x7f800000,
                                                      CONCAT420(0x7f800000,
                                                                CONCAT416(0x7f800000,
                                                                          CONCAT412(0x7f800000,
                                                                                    CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
            }
            else {
              p_Var12 = context->args->filter;
              if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                   RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar10->field_8).field_0x2 & 0x40) != 0))))
              {
                local_6a0._0_8_ = pSVar73;
                auVar90 = ZEXT1632(auVar159._0_16_);
                (*p_Var12)(&local_710);
                auVar90 = vpcmpeqd_avx2(auVar90,auVar90);
                auVar159 = ZEXT3264(auVar90);
                auVar146 = ZEXT1664(ZEXT816(0) << 0x40);
                pSVar73 = (Scene *)local_6a0._0_8_;
              }
              auVar132 = vpcmpeqd_avx2(local_680,auVar146._0_32_);
              auVar115 = auVar159._0_32_ ^ auVar132;
              auVar90 = auVar159._0_32_ & ~auVar132;
              auVar175 = ZEXT3264(CONCAT428(0x7f800000,
                                            CONCAT424(0x7f800000,
                                                      CONCAT420(0x7f800000,
                                                                CONCAT416(0x7f800000,
                                                                          CONCAT412(0x7f800000,
                                                                                    CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
              if ((((((((auVar90 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar90 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar90 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar90 >> 0x7f,0) != '\0') ||
                    (auVar90 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar90 >> 0xbf,0) != '\0') ||
                  (auVar90 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar90[0x1f] < '\0') {
                auVar93._0_4_ = auVar159._0_4_ ^ auVar132._0_4_;
                auVar93._4_4_ = auVar159._4_4_ ^ auVar132._4_4_;
                auVar93._8_4_ = auVar159._8_4_ ^ auVar132._8_4_;
                auVar93._12_4_ = auVar159._12_4_ ^ auVar132._12_4_;
                auVar93._16_4_ = auVar159._16_4_ ^ auVar132._16_4_;
                auVar93._20_4_ = auVar159._20_4_ ^ auVar132._20_4_;
                auVar93._24_4_ = auVar159._24_4_ ^ auVar132._24_4_;
                auVar93._28_4_ = auVar159._28_4_ ^ auVar132._28_4_;
                auVar90 = vmaskmovps_avx(auVar93,*(undefined1 (*) [32])local_710.hit);
                *(undefined1 (*) [32])(local_710.ray + 0x180) = auVar90;
                auVar90 = vmaskmovps_avx(auVar93,*(undefined1 (*) [32])(local_710.hit + 0x20));
                *(undefined1 (*) [32])(local_710.ray + 0x1a0) = auVar90;
                auVar90 = vmaskmovps_avx(auVar93,*(undefined1 (*) [32])(local_710.hit + 0x40));
                *(undefined1 (*) [32])(local_710.ray + 0x1c0) = auVar90;
                auVar90 = vmaskmovps_avx(auVar93,*(undefined1 (*) [32])(local_710.hit + 0x60));
                *(undefined1 (*) [32])(local_710.ray + 0x1e0) = auVar90;
                auVar90 = vmaskmovps_avx(auVar93,*(undefined1 (*) [32])(local_710.hit + 0x80));
                *(undefined1 (*) [32])(local_710.ray + 0x200) = auVar90;
                auVar90 = vpmaskmovd_avx2(auVar93,*(undefined1 (*) [32])(local_710.hit + 0xa0));
                *(undefined1 (*) [32])(local_710.ray + 0x220) = auVar90;
                auVar90 = vpmaskmovd_avx2(auVar93,*(undefined1 (*) [32])(local_710.hit + 0xc0));
                *(undefined1 (*) [32])(local_710.ray + 0x240) = auVar90;
                auVar90 = vpmaskmovd_avx2(auVar93,*(undefined1 (*) [32])(local_710.hit + 0xe0));
                *(undefined1 (*) [32])(local_710.ray + 0x260) = auVar90;
                auVar90 = vpmaskmovd_avx2(auVar93,*(undefined1 (*) [32])(local_710.hit + 0x100));
                *(undefined1 (*) [32])(local_710.ray + 0x280) = auVar90;
              }
            }
            if ((((((((auVar115 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar115 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar115 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar115 >> 0x7f,0) == '\0') &&
                  (auVar115 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar115 >> 0xbf,0) == '\0') &&
                (auVar115 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar115[0x1f]) {
              *(undefined4 *)(ray + k * 4 + 0x100) = local_6e0._0_4_;
            }
            else {
              local_6e0._0_16_ = ZEXT416(*(uint *)(ray + k * 4 + 0x100));
            }
            *(undefined4 *)(local_6c0 + uVar74 * 4) = 0;
            auVar83._4_4_ = local_6e0._0_4_;
            auVar83._0_4_ = local_6e0._0_4_;
            auVar83._8_4_ = local_6e0._0_4_;
            auVar83._12_4_ = local_6e0._0_4_;
            auVar83._16_4_ = local_6e0._0_4_;
            auVar83._20_4_ = local_6e0._0_4_;
            auVar83._24_4_ = local_6e0._0_4_;
            auVar83._28_4_ = local_6e0._0_4_;
            auVar90 = vcmpps_avx(_local_5e0,auVar83,2);
            local_6c0 = vandps_avx(auVar90,local_6c0);
          }
          if ((((((((local_6c0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (local_6c0 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (local_6c0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(local_6c0 >> 0x7f,0) == '\0') &&
                (local_6c0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(local_6c0 >> 0xbf,0) == '\0') &&
              (local_6c0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < local_6c0[0x1f]) {
            return;
          }
          auVar90 = vblendvps_avx(auVar175._0_32_,_local_5e0,local_6c0);
          auVar115 = vshufps_avx(auVar90,auVar90,0xb1);
          auVar115 = vminps_avx(auVar90,auVar115);
          auVar132 = vshufpd_avx(auVar115,auVar115,5);
          auVar115 = vminps_avx(auVar115,auVar132);
          auVar132 = vpermpd_avx2(auVar115,0x4e);
          auVar115 = vminps_avx(auVar115,auVar132);
          auVar115 = vcmpps_avx(auVar90,auVar115,0);
          auVar132 = local_6c0 & auVar115;
          auVar90 = local_6c0;
          if ((((((((auVar132 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar132 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar132 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar132 >> 0x7f,0) != '\0') ||
                (auVar132 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar132 >> 0xbf,0) != '\0') ||
              (auVar132 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar132[0x1f] < '\0') {
            auVar90 = vandps_avx(auVar115,local_6c0);
          }
          uVar70 = vmovmskps_avx(auVar90);
          uVar71 = 0;
          for (; (uVar70 & 1) == 0; uVar70 = uVar70 >> 1 | 0x80000000) {
            uVar71 = uVar71 + 1;
          }
        } while( true );
      }
    }
  }
  return;
}

Assistant:

static __forceinline void intersect(const Precalculations& pre, RayHitK<K>& ray, size_t k, RayQueryContext* context, const Primitive& line)
      {
        STAT3(normal.trav_prims,1,1,1);
        const LineSegments* geom = context->scene->get<LineSegments>(line.geomID());
        Vec4vf<M> v0,v1; 
        vbool<M> cL,cR;
        line.gather(v0,v1,cL,cR,geom);
        const vbool<M> valid = line.valid();
        ConeCurveIntersectorK<M,K>::intersect(valid,ray,k,context,geom,pre,v0,v1,cL,cR,Intersect1KEpilogM<M,K,filter>(ray,k,context,line.geomID(),line.primID()));
      }